

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_const_impl.h
# Opt level: O3

int secp256k1_ecmult_const_xonly
              (secp256k1_fe *r,secp256k1_fe *n,secp256k1_fe *d,secp256k1_scalar *q,
              int known_on_curve)

{
  char *pcVar1;
  uint *pk_parity;
  undefined4 *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  secp256k1_callback *error_callback;
  byte bVar178;
  int iVar179;
  uint uVar180;
  int iVar181;
  uint32_t uVar182;
  uint uVar183;
  ulong uVar184;
  FILE *__stream;
  size_t sVar185;
  secp256k1_ge *psVar186;
  secp256k1_gej *psVar187;
  secp256k1_context *ctx;
  secp256k1_scratch *scratch;
  void *pvVar188;
  ulong extraout_RAX;
  byte bVar189;
  undefined4 uVar190;
  uint uVar191;
  uint uVar192;
  long lVar193;
  secp256k1_fe *psVar194;
  void *pvVar195;
  secp256k1_scratch *psVar196;
  int *piVar197;
  secp256k1_gej *gen;
  secp256k1_gej *gen_00;
  ulong uVar198;
  ulong uVar199;
  ulong uVar200;
  long lVar201;
  secp256k1_context *psVar202;
  uint64_t *puVar203;
  secp256k1_keypair *keypair;
  secp256k1_scalar sVar204;
  int iVar205;
  undefined1 *puVar206;
  secp256k1_gej *psVar207;
  secp256k1_gej *psVar208;
  undefined8 *puVar209;
  uint64_t *puVar210;
  secp256k1_gej *psVar211;
  secp256k1_fe *psVar212;
  secp256k1_context *a;
  undefined8 *puVar213;
  uint64_t uVar214;
  ulong uVar215;
  _func_void_char_ptr_void_ptr *na;
  uint64_t uVar216;
  secp256k1_fe *psVar217;
  long lVar218;
  size_t sVar219;
  secp256k1_gej *r_00;
  ulong unaff_R13;
  secp256k1_ge *psVar220;
  char *pcVar221;
  uchar *puVar222;
  secp256k1_ge *a_00;
  secp256k1_context *a_01;
  secp256k1_xonly_pubkey *psVar223;
  int iVar224;
  secp256k1_ge_storage (*pasVar225) [16];
  undefined1 *puVar226;
  secp256k1_scalar *psVar227;
  bool bVar228;
  byte bVar229;
  undefined1 auVar230 [16];
  uint64_t tmp3_1;
  secp256k1_fe i;
  uint64_t tmp3_3;
  uint64_t tmp2_3;
  secp256k1_gej rj;
  secp256k1_ge p;
  ulong uStack_1cd0;
  secp256k1_scalar *psStack_1cc8;
  ulong uStack_1cc0;
  ulong uStack_1cb0;
  int iStack_1c9c;
  secp256k1_gej *psStack_1c98;
  secp256k1_gej *psStack_1c90;
  long lStack_1c88;
  long lStack_1c80;
  secp256k1_callback *psStack_1c78;
  undefined1 auStack_1c70 [16];
  undefined1 auStack_1c60 [16];
  undefined1 auStack_1c50 [16];
  int iStack_1c40;
  ulong uStack_1c30;
  uint uStack_1c24;
  undefined1 auStack_1c20 [16];
  undefined1 auStack_1c10 [16];
  int iStack_1bf4;
  undefined1 auStack_1bf0 [80];
  undefined1 auStack_1ba0 [16];
  undefined1 auStack_1b90 [16];
  uint64_t uStack_1b80;
  uint64_t uStack_1b78;
  uint64_t uStack_1b70;
  undefined8 *puStack_1b68;
  long lStack_1b60;
  void *pvStack_1b58;
  _func_void_char_ptr_void_ptr *p_Stack_1b50;
  secp256k1_schnorrsig_extraparams sStack_1b48;
  undefined1 auStack_1b30 [16];
  undefined1 auStack_1b20 [16];
  undefined1 auStack_1b10 [16];
  undefined1 auStack_1b00 [16];
  undefined1 auStack_19d0 [32];
  uchar auStack_19b0 [8];
  undefined8 auStack_19a8 [3];
  undefined1 auStack_1990 [31];
  uchar uStack_1971;
  uchar auStack_1970 [8];
  int iStack_1968;
  int iStack_1964;
  undefined1 auStack_1960 [15];
  uchar uStack_1951;
  undefined1 auStack_1690 [16];
  undefined1 auStack_1680 [16];
  uint64_t uStack_1670;
  undefined8 uStack_1668;
  undefined1 auStack_1660 [32];
  undefined4 uStack_1640;
  undefined4 uStack_163c;
  int iStack_1638;
  int iStack_1634;
  int iStack_1630;
  undefined1 auStack_1390 [32];
  byte abStack_1370 [80];
  undefined8 auStack_1320 [130];
  undefined1 auStack_f10 [104];
  secp256k1_context asStack_ea8 [5];
  secp256k1_ge sStack_a30;
  undefined1 auStack_9c8 [8];
  undefined1 auStack_9c0 [152];
  secp256k1_context asStack_928 [9];
  secp256k1_gej *psStack_208;
  secp256k1_fe *psStack_200;
  ulong uStack_1f8;
  secp256k1_fe *psStack_1f0;
  secp256k1_fe *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  int local_1d4;
  secp256k1_fe *local_1d0;
  secp256k1_fe *local_1c8;
  ulong local_1c0;
  secp256k1_fe *local_1b8;
  secp256k1_scalar *local_1b0;
  undefined1 local_1a8 [24];
  ulong uStack_190;
  ulong local_188;
  ulong local_180;
  secp256k1_fe local_178;
  ulong local_148;
  ulong local_140;
  undefined1 local_138 [24];
  ulong uStack_120;
  uint64_t local_118;
  ulong local_110;
  undefined1 local_d8 [120];
  ulong local_60;
  ulong local_58;
  ulong local_50;
  long local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  bVar229 = 0;
  psVar187 = (secp256k1_gej *)(ulong)(uint)known_on_curve;
  psStack_1e0 = (secp256k1_gej *)0x11489c;
  psVar208 = (secp256k1_gej *)n;
  psVar211 = (secp256k1_gej *)n;
  secp256k1_fe_verify(n);
  if (n->magnitude < 9) {
    psVar187 = (secp256k1_gej *)local_1a8;
    uVar200 = n->n[0];
    uVar215 = n->n[1];
    psVar217 = (secp256k1_fe *)n->n[2];
    unaff_R13 = n->n[3];
    uVar199 = n->n[4];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar200 * 2;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = unaff_R13;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar215 * 2;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = psVar217;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar199;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar199;
    uVar184 = SUB168(auVar5 * auVar85,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar184 & 0xfffffffffffff;
    auVar3 = auVar4 * auVar84 + auVar3 * auVar83 + auVar6 * ZEXT816(0x1000003d10);
    uVar198 = auVar3._0_8_;
    local_138._0_8_ = uVar198 & 0xfffffffffffff;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar198 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar194 = (secp256k1_fe *)(uVar199 * 2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar200;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = psVar194;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar215 * 2;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = unaff_R13;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = psVar217;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = psVar217;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar184 >> 0x34 | SUB168(auVar5 * auVar85,8) << 0xc;
    auVar3 = auVar7 * auVar86 + auVar147 + auVar8 * auVar87 + auVar9 * auVar88 +
             auVar10 * ZEXT816(0x1000003d10);
    local_d8._64_8_ = auVar3._0_8_;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = (ulong)local_d8._64_8_ >> 0x34 | auVar3._8_8_ << 0xc;
    local_178.n[0] = (local_d8._64_8_ & 0xfffffffffffff) >> 0x30;
    local_d8._64_8_ = local_d8._64_8_ & 0xffffffffffff;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar200;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar200;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar215;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = psVar194;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = (long)psVar217 * 2;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = unaff_R13;
    auVar3 = auVar12 * auVar90 + auVar148 + auVar13 * auVar91;
    uVar199 = auVar3._0_8_;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar199 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = (uVar199 & 0xfffffffffffff) << 4 | local_178.n[0];
    auVar3 = auVar11 * auVar89 + ZEXT816(0x1000003d1) * auVar92;
    uVar199 = auVar3._0_8_;
    local_1a8._0_8_ = uVar199 & 0xfffffffffffff;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar199 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar200 * 2;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar215;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = psVar217;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = psVar194;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = unaff_R13;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = unaff_R13;
    auVar4 = auVar15 * auVar94 + auVar150 + auVar16 * auVar95;
    uVar199 = auVar4._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar199 & 0xfffffffffffff;
    auVar3 = auVar14 * auVar93 + auVar149 + auVar17 * ZEXT816(0x1000003d10);
    uVar184 = auVar3._0_8_;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar199 >> 0x34 | auVar4._8_8_ << 0xc;
    local_1a8._8_8_ = uVar184 & 0xfffffffffffff;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar184 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar200 * 2;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = psVar217;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar215;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar215;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = unaff_R13;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = psVar194;
    auVar152 = auVar20 * auVar98 + auVar152;
    uVar200 = auVar152._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar200 & 0xfffffffffffff;
    auVar3 = auVar18 * auVar96 + auVar151 + auVar19 * auVar97 + auVar21 * ZEXT816(0x1000003d10);
    uVar215 = auVar3._0_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (uVar215 >> 0x34 | auVar3._8_8_ << 0xc) + local_138._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar200 >> 0x34 | auVar152._8_8_ << 0xc;
    auVar153 = auVar22 * ZEXT816(0x1000003d10) + auVar153;
    uVar200 = auVar153._0_8_;
    uStack_190 = uVar200 & 0xfffffffffffff;
    local_1a8._16_8_ = uVar215 & 0xfffffffffffff;
    local_188 = (uVar200 >> 0x34 | auVar153._8_8_ << 0xc) + local_d8._64_8_;
    local_180 = 1;
    psStack_1e0 = (secp256k1_gej *)0x114b13;
    local_1d4 = known_on_curve;
    local_1d0 = d;
    local_1c8 = n;
    local_1b8 = r;
    local_1b0 = q;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    psStack_1e0 = (secp256k1_gej *)0x114b21;
    secp256k1_fe_mul((secp256k1_fe *)psVar187,(secp256k1_fe *)psVar187,n);
    if (d == (secp256k1_fe *)0x0) {
      psStack_1e0 = (secp256k1_gej *)0x114f29;
      secp256k1_fe_verify((secp256k1_fe *)local_1a8);
      local_1a8._0_8_ = local_1a8._0_8_ + 2;
      local_180 = (ulong)((int)local_180 + 1);
      psStack_1e0 = (secp256k1_gej *)0x114f3f;
      secp256k1_fe_verify((secp256k1_fe *)local_1a8);
      q = (secp256k1_scalar *)n;
      if (local_1d4 == 0) {
        psVar212 = (secp256k1_fe *)local_1a8;
LAB_00114f4b:
        psStack_1e0 = (secp256k1_gej *)0x114f50;
        iVar179 = secp256k1_fe_is_square_var(psVar212);
        q = (secp256k1_scalar *)n;
        if (iVar179 == 0) {
          return 0;
        }
      }
LAB_00114f58:
      r = (secp256k1_fe *)local_1a8;
      psStack_1e0 = (secp256k1_gej *)0x114f70;
      psVar208 = (secp256k1_gej *)r;
      secp256k1_fe_mul((secp256k1_fe *)(local_d8 + 0x40),r,(secp256k1_fe *)q);
      psStack_1e0 = (secp256k1_gej *)0x114f78;
      psVar211 = (secp256k1_gej *)r;
      secp256k1_fe_verify(r);
      n = psVar217;
      if (8 < (int)local_180) goto LAB_001154d9;
      psVar187 = (secp256k1_gej *)(local_d8 + 0x70);
      n = (secp256k1_fe *)local_1a8._16_8_;
      unaff_R13 = uStack_190;
      q = (secp256k1_scalar *)0xfffffffffffff;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_1a8._0_8_ * 2;
      auVar115._8_8_ = 0;
      auVar115._0_8_ = uStack_190;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_1a8._8_8_ * 2;
      auVar116._8_8_ = 0;
      auVar116._0_8_ = local_1a8._16_8_;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_188;
      auVar117._8_8_ = 0;
      auVar117._0_8_ = local_188;
      uVar200 = SUB168(auVar45 * auVar117,0);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar200 & 0xfffffffffffff;
      auVar3 = auVar44 * auVar116 + auVar43 * auVar115 + auVar46 * ZEXT816(0x1000003d10);
      uVar215 = auVar3._0_8_;
      local_138._0_8_ = uVar215 & 0xfffffffffffff;
      auVar161._8_8_ = 0;
      auVar161._0_8_ = uVar215 >> 0x34 | auVar3._8_8_ << 0xc;
      psVar194 = (secp256k1_fe *)(local_188 * 2);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_1a8._0_8_;
      auVar118._8_8_ = 0;
      auVar118._0_8_ = psVar194;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_1a8._8_8_ * 2;
      auVar119._8_8_ = 0;
      auVar119._0_8_ = uStack_190;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_1a8._16_8_;
      auVar120._8_8_ = 0;
      auVar120._0_8_ = local_1a8._16_8_;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar200 >> 0x34 | SUB168(auVar45 * auVar117,8) << 0xc;
      auVar3 = auVar47 * auVar118 + auVar161 + auVar48 * auVar119 + auVar49 * auVar120 +
               auVar50 * ZEXT816(0x1000003d10);
      uVar200 = auVar3._0_8_;
      auVar162._8_8_ = 0;
      auVar162._0_8_ = uVar200 >> 0x34 | auVar3._8_8_ << 0xc;
      local_1c0 = (uVar200 & 0xfffffffffffff) >> 0x30;
      psVar208 = (secp256k1_gej *)(uVar200 & 0xffffffffffff);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_1a8._0_8_;
      auVar121._8_8_ = 0;
      auVar121._0_8_ = local_1a8._0_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_1a8._8_8_;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = psVar194;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_1a8._16_8_ * 2;
      auVar123._8_8_ = 0;
      auVar123._0_8_ = uStack_190;
      auVar3 = auVar52 * auVar122 + auVar162 + auVar53 * auVar123;
      uVar200 = auVar3._0_8_;
      auVar164._8_8_ = 0;
      auVar164._0_8_ = uVar200 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar124._8_8_ = 0;
      auVar124._0_8_ = (uVar200 & 0xfffffffffffff) << 4 | local_1c0;
      auVar3 = auVar51 * auVar121 + ZEXT816(0x1000003d1) * auVar124;
      uVar200 = auVar3._0_8_;
      local_d8._112_8_ = uVar200 & 0xfffffffffffff;
      auVar163._8_8_ = 0;
      auVar163._0_8_ = uVar200 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_1a8._0_8_ * 2;
      auVar125._8_8_ = 0;
      auVar125._0_8_ = local_1a8._8_8_;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_1a8._16_8_;
      auVar126._8_8_ = 0;
      auVar126._0_8_ = psVar194;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = uStack_190;
      auVar127._8_8_ = 0;
      auVar127._0_8_ = uStack_190;
      auVar4 = auVar55 * auVar126 + auVar164 + auVar56 * auVar127;
      uVar200 = auVar4._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar200 & 0xfffffffffffff;
      auVar3 = auVar54 * auVar125 + auVar163 + auVar57 * ZEXT816(0x1000003d10);
      uVar215 = auVar3._0_8_;
      auVar166._8_8_ = 0;
      auVar166._0_8_ = uVar200 >> 0x34 | auVar4._8_8_ << 0xc;
      local_60 = uVar215 & 0xfffffffffffff;
      auVar165._8_8_ = 0;
      auVar165._0_8_ = uVar215 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_1a8._0_8_ * 2;
      auVar128._8_8_ = 0;
      auVar128._0_8_ = local_1a8._16_8_;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = local_1a8._8_8_;
      auVar129._8_8_ = 0;
      auVar129._0_8_ = local_1a8._8_8_;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = uStack_190;
      auVar130._8_8_ = 0;
      auVar130._0_8_ = psVar194;
      auVar166 = auVar60 * auVar130 + auVar166;
      uVar200 = auVar166._0_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar200 & 0xfffffffffffff;
      auVar3 = auVar58 * auVar128 + auVar165 + auVar59 * auVar129 + auVar61 * ZEXT816(0x1000003d10);
      uVar215 = auVar3._0_8_;
      r = (secp256k1_fe *)(uVar200 >> 0x34 | auVar166._8_8_ << 0xc);
      local_58 = uVar215 & 0xfffffffffffff;
      auVar167._8_8_ = 0;
      auVar167._0_8_ = (uVar215 >> 0x34 | auVar3._8_8_ << 0xc) + local_138._0_8_;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = r;
      auVar167 = auVar62 * ZEXT816(0x1000003d10) + auVar167;
      uVar200 = auVar167._0_8_;
      local_50 = uVar200 & 0xfffffffffffff;
      local_48 = (long)(psVar208->x).n + (uVar200 >> 0x34 | auVar167._8_8_ << 0xc);
      local_40 = 1;
      psStack_1e0 = (secp256k1_gej *)0x1151c8;
      psVar211 = psVar187;
      local_178.n[0] = (uint64_t)psVar208;
      secp256k1_fe_verify((secp256k1_fe *)psVar187);
      local_38 = 0;
      if (*local_1b0 == 0) goto LAB_001154de;
      r = (secp256k1_fe *)local_138;
      psVar208 = (secp256k1_gej *)(local_d8 + 0x40);
      psStack_1e0 = (secp256k1_gej *)0x1151f5;
      secp256k1_ecmult_const((secp256k1_gej *)r,(secp256k1_ge *)psVar208,local_1b0);
      psStack_1e0 = (secp256k1_gej *)0x1151fd;
      psVar211 = (secp256k1_gej *)r;
      secp256k1_gej_verify((secp256k1_gej *)r);
      if (local_d8._48_4_ != 0) goto LAB_001154e3;
      r = (secp256k1_fe *)local_d8;
      psStack_1e0 = (secp256k1_gej *)0x11521a;
      psVar211 = (secp256k1_gej *)r;
      secp256k1_fe_verify(r);
      if ((int)local_d8._40_4_ < 9) {
        auVar63._8_8_ = 0;
        auVar63._0_8_ = local_d8._0_8_ * 2;
        auVar131._8_8_ = 0;
        auVar131._0_8_ = local_d8._24_8_;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = local_d8._8_8_ * 2;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = local_d8._16_8_;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = local_d8._32_8_;
        auVar133._8_8_ = 0;
        auVar133._0_8_ = local_d8._32_8_;
        uVar215 = SUB168(auVar65 * auVar133,0);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar215 & 0xfffffffffffff;
        auVar3 = auVar64 * auVar132 + auVar63 * auVar131 + auVar66 * ZEXT816(0x1000003d10);
        uVar200 = auVar3._0_8_;
        local_1c0 = uVar200 & 0xfffffffffffff;
        auVar168._8_8_ = 0;
        auVar168._0_8_ = uVar200 >> 0x34 | auVar3._8_8_ << 0xc;
        uVar200 = local_d8._32_8_ * 2;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = local_d8._0_8_;
        auVar134._8_8_ = 0;
        auVar134._0_8_ = uVar200;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = local_d8._8_8_ * 2;
        auVar135._8_8_ = 0;
        auVar135._0_8_ = local_d8._24_8_;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = local_d8._16_8_;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = local_d8._16_8_;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar215 >> 0x34 | SUB168(auVar65 * auVar133,8) << 0xc;
        auVar3 = auVar67 * auVar134 + auVar168 + auVar68 * auVar135 + auVar69 * auVar136 +
                 auVar70 * ZEXT816(0x1000003d10);
        local_140 = auVar3._0_8_;
        auVar169._8_8_ = 0;
        auVar169._0_8_ = local_140 >> 0x34 | auVar3._8_8_ << 0xc;
        local_148 = (local_140 & 0xfffffffffffff) >> 0x30;
        local_140 = local_140 & 0xffffffffffff;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = local_d8._0_8_;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = local_d8._0_8_;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = local_d8._8_8_;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = uVar200;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = local_d8._16_8_ * 2;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = local_d8._24_8_;
        auVar3 = auVar72 * auVar138 + auVar169 + auVar73 * auVar139;
        uVar215 = auVar3._0_8_;
        auVar171._8_8_ = 0;
        auVar171._0_8_ = uVar215 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar140._8_8_ = 0;
        auVar140._0_8_ = (uVar215 & 0xfffffffffffff) << 4 | local_148;
        auVar3 = auVar71 * auVar137 + ZEXT816(0x1000003d1) * auVar140;
        uVar215 = auVar3._0_8_;
        local_178.n[0] = uVar215 & 0xfffffffffffff;
        auVar170._8_8_ = 0;
        auVar170._0_8_ = uVar215 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = local_d8._0_8_ * 2;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = local_d8._8_8_;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = local_d8._16_8_;
        auVar142._8_8_ = 0;
        auVar142._0_8_ = uVar200;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = local_d8._24_8_;
        auVar143._8_8_ = 0;
        auVar143._0_8_ = local_d8._24_8_;
        auVar4 = auVar75 * auVar142 + auVar171 + auVar76 * auVar143;
        uVar215 = auVar4._0_8_;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar215 & 0xfffffffffffff;
        auVar3 = auVar74 * auVar141 + auVar170 + auVar77 * ZEXT816(0x1000003d10);
        uVar199 = auVar3._0_8_;
        auVar173._8_8_ = 0;
        auVar173._0_8_ = uVar215 >> 0x34 | auVar4._8_8_ << 0xc;
        local_178.n[1] = uVar199 & 0xfffffffffffff;
        auVar172._8_8_ = 0;
        auVar172._0_8_ = uVar199 >> 0x34 | auVar3._8_8_ << 0xc;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = local_d8._0_8_ * 2;
        auVar144._8_8_ = 0;
        auVar144._0_8_ = local_d8._16_8_;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = local_d8._8_8_;
        auVar145._8_8_ = 0;
        auVar145._0_8_ = local_d8._8_8_;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = local_d8._24_8_;
        auVar146._8_8_ = 0;
        auVar146._0_8_ = uVar200;
        auVar173 = auVar80 * auVar146 + auVar173;
        uVar200 = auVar173._0_8_;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar200 & 0xfffffffffffff;
        auVar3 = auVar78 * auVar144 + auVar172 + auVar79 * auVar145 +
                 auVar81 * ZEXT816(0x1000003d10);
        uVar215 = auVar3._0_8_;
        local_178.n[2] = uVar215 & 0xfffffffffffff;
        auVar174._8_8_ = 0;
        auVar174._0_8_ = (uVar215 >> 0x34 | auVar3._8_8_ << 0xc) + local_1c0;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar200 >> 0x34 | auVar173._8_8_ << 0xc;
        auVar174 = auVar82 * ZEXT816(0x1000003d10) + auVar174;
        uVar200 = auVar174._0_8_;
        local_178.n[3] = uVar200 & 0xfffffffffffff;
        local_178.n[4] = (uVar200 >> 0x34 | auVar174._8_8_ << 0xc) + local_140;
        local_178.magnitude = 1;
        local_178.normalized = 0;
        psStack_1e0 = (secp256k1_gej *)0x11546d;
        secp256k1_fe_verify(&local_178);
        psStack_1e0 = (secp256k1_gej *)0x11547d;
        secp256k1_fe_mul(&local_178,&local_178,(secp256k1_fe *)local_1a8);
        if (local_1d0 != (secp256k1_fe *)0x0) {
          psStack_1e0 = (secp256k1_gej *)0x115494;
          secp256k1_fe_mul(&local_178,&local_178,local_1d0);
        }
        psStack_1e0 = (secp256k1_gej *)0x1154a4;
        secp256k1_fe_inv(&local_178,&local_178);
        psStack_1e0 = (secp256k1_gej *)0x1154b9;
        secp256k1_fe_mul(local_1b8,(secp256k1_fe *)local_138,&local_178);
        return 1;
      }
      goto LAB_001154e8;
    }
    psStack_1e0 = (secp256k1_gej *)0x114b32;
    secp256k1_fe_verify(d);
    uVar200 = (d->n[4] >> 0x30) * 0x1000003d1 + d->n[0];
    uVar215 = (uVar200 >> 0x34) + d->n[1];
    psVar208 = (secp256k1_gej *)((uVar215 >> 0x34) + d->n[2]);
    psVar211 = (secp256k1_gej *)(((ulong)psVar208 >> 0x34) + d->n[3]);
    uVar199 = ((ulong)psVar211 >> 0x34) + (d->n[4] & 0xffffffffffff);
    if ((((uVar215 | uVar200 | (ulong)psVar208 | (ulong)psVar211) & 0xfffffffffffff) == 0 &&
         uVar199 == 0) ||
       (((uVar200 ^ 0x1000003d0) & uVar215 & (ulong)psVar208 & (ulong)psVar211 &
        (uVar199 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_001154ed;
    psStack_1e0 = (secp256k1_gej *)0x114bd6;
    psVar212 = d;
    secp256k1_fe_verify(d);
    uVar180 = (uint)psVar212;
    if (8 < d->magnitude) goto LAB_001154f2;
    psVar187 = (secp256k1_gej *)local_138;
    uVar200 = d->n[0];
    uVar215 = d->n[1];
    psVar217 = (secp256k1_fe *)d->n[2];
    unaff_R13 = d->n[3];
    uVar199 = d->n[4];
    n = (secp256k1_fe *)0xfffffffffffff;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar200 * 2;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = unaff_R13;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar215 * 2;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = psVar217;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar199;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar199;
    uVar184 = SUB168(auVar25 * auVar101,0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar184 & 0xfffffffffffff;
    auVar3 = auVar24 * auVar100 + auVar23 * auVar99 + auVar26 * ZEXT816(0x1000003d10);
    uVar198 = auVar3._0_8_;
    local_d8._64_8_ = uVar198 & 0xfffffffffffff;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar198 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar194 = (secp256k1_fe *)(uVar199 * 2);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar200;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = psVar194;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar215 * 2;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = unaff_R13;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = psVar217;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = psVar217;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar184 >> 0x34 | SUB168(auVar25 * auVar101,8) << 0xc;
    auVar3 = auVar27 * auVar102 + auVar154 + auVar28 * auVar103 + auVar29 * auVar104 +
             auVar30 * ZEXT816(0x1000003d10);
    uVar199 = auVar3._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar199 >> 0x34 | auVar3._8_8_ << 0xc;
    local_1c0 = (uVar199 & 0xfffffffffffff) >> 0x30;
    psVar208 = (secp256k1_gej *)(uVar199 & 0xffffffffffff);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar200;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar200;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar215;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = psVar194;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (long)psVar217 * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = unaff_R13;
    auVar3 = auVar32 * auVar106 + auVar155 + auVar33 * auVar107;
    uVar199 = auVar3._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar199 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = (uVar199 & 0xfffffffffffff) << 4 | local_1c0;
    auVar3 = auVar31 * auVar105 + ZEXT816(0x1000003d1) * auVar108;
    uVar199 = auVar3._0_8_;
    local_138._0_8_ = uVar199 & 0xfffffffffffff;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar199 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar200 * 2;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar215;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = psVar217;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = psVar194;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = unaff_R13;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = unaff_R13;
    auVar4 = auVar35 * auVar110 + auVar157 + auVar36 * auVar111;
    uVar199 = auVar4._0_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar199 & 0xfffffffffffff;
    auVar3 = auVar34 * auVar109 + auVar156 + auVar37 * ZEXT816(0x1000003d10);
    uVar184 = auVar3._0_8_;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar199 >> 0x34 | auVar4._8_8_ << 0xc;
    local_138._8_8_ = uVar184 & 0xfffffffffffff;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = uVar184 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar200 * 2;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = psVar217;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar215;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar215;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = unaff_R13;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = psVar194;
    auVar159 = auVar40 * auVar114 + auVar159;
    uVar200 = auVar159._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar200 & 0xfffffffffffff;
    auVar3 = auVar38 * auVar112 + auVar158 + auVar39 * auVar113 + auVar41 * ZEXT816(0x1000003d10);
    uVar215 = auVar3._0_8_;
    d = (secp256k1_fe *)(uVar200 >> 0x34 | auVar159._8_8_ << 0xc);
    auVar160._8_8_ = 0;
    auVar160._0_8_ = (uVar215 >> 0x34 | auVar3._8_8_ << 0xc) + local_d8._64_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = d;
    auVar160 = auVar42 * ZEXT816(0x1000003d10) + auVar160;
    uVar200 = auVar160._0_8_;
    uStack_120 = uVar200 & 0xfffffffffffff;
    local_138._16_8_ = uVar215 & 0xfffffffffffff;
    local_118 = (long)(psVar208->x).n + (uVar200 >> 0x34 | auVar160._8_8_ << 0xc);
    local_110 = 1;
    psStack_1e0 = (secp256k1_gej *)0x114e26;
    local_178.n[0] = (uint64_t)psVar208;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    psStack_1e0 = (secp256k1_gej *)0x114e2e;
    psVar211 = psVar187;
    secp256k1_fe_verify((secp256k1_fe *)psVar187);
    uVar180 = (uint)psVar211;
    if (0x10 < (int)local_110) goto LAB_001154f7;
    d = (secp256k1_fe *)local_138;
    local_138._0_8_ = local_138._0_8_ * 2;
    local_138._8_8_ = local_138._8_8_ * 2;
    uStack_120 = uStack_120 * 2;
    local_138._16_8_ = local_138._16_8_ * 2;
    local_118 = local_118 << 1;
    local_110 = (ulong)(uint)((int)local_110 * 2);
    psStack_1e0 = (secp256k1_gej *)0x114e74;
    secp256k1_fe_verify(d);
    psVar194 = local_1d0;
    psStack_1e0 = (secp256k1_gej *)0x114e87;
    psVar208 = (secp256k1_gej *)d;
    secp256k1_fe_mul(d,d,local_1d0);
    psStack_1e0 = (secp256k1_gej *)0x114e94;
    secp256k1_fe_verify((secp256k1_fe *)local_1a8);
    psStack_1e0 = (secp256k1_gej *)0x114e9c;
    psVar211 = (secp256k1_gej *)d;
    secp256k1_fe_verify(d);
    n = local_1c8;
    uVar180 = (uint)psVar211;
    if ((int)local_110 + (int)local_180 < 0x21) {
      local_1a8._0_8_ = local_1a8._0_8_ + local_138._0_8_;
      local_1a8._8_8_ = local_1a8._8_8_ + local_138._8_8_;
      local_1a8._16_8_ = local_1a8._16_8_ + local_138._16_8_;
      uStack_190 = uStack_190 + uStack_120;
      local_188 = local_188 + local_118;
      local_180 = (ulong)(uint)((int)local_110 + (int)local_180);
      psStack_1e0 = (secp256k1_gej *)0x114ef8;
      secp256k1_fe_verify((secp256k1_fe *)local_1a8);
      q = (secp256k1_scalar *)n;
      if (local_1d4 == 0) {
        psVar212 = (secp256k1_fe *)(local_d8 + 0x40);
        psStack_1e0 = (secp256k1_gej *)0x114f17;
        secp256k1_fe_mul(psVar212,(secp256k1_fe *)local_1a8,psVar194);
        goto LAB_00114f4b;
      }
      goto LAB_00114f58;
    }
  }
  else {
    psStack_1e0 = (secp256k1_gej *)0x1154d9;
    secp256k1_ecmult_const_xonly_cold_9();
    psVar194 = d;
LAB_001154d9:
    psStack_1e0 = (secp256k1_gej *)0x1154de;
    secp256k1_ecmult_const_xonly_cold_8();
LAB_001154de:
    psStack_1e0 = (secp256k1_gej *)0x1154e3;
    secp256k1_ecmult_const_xonly_cold_7();
LAB_001154e3:
    psStack_1e0 = (secp256k1_gej *)0x1154e8;
    secp256k1_ecmult_const_xonly_cold_5();
LAB_001154e8:
    psStack_1e0 = (secp256k1_gej *)0x1154ed;
    secp256k1_ecmult_const_xonly_cold_6();
    d = r;
    psVar217 = n;
    n = (secp256k1_fe *)q;
LAB_001154ed:
    uVar180 = (uint)psVar211;
    psStack_1e0 = (secp256k1_gej *)0x1154f2;
    secp256k1_ecmult_const_xonly_cold_1();
LAB_001154f2:
    psStack_1e0 = (secp256k1_gej *)0x1154f7;
    secp256k1_ecmult_const_xonly_cold_4();
LAB_001154f7:
    psStack_1e0 = (secp256k1_gej *)0x1154fc;
    secp256k1_ecmult_const_xonly_cold_3();
  }
  psStack_1e0 = (secp256k1_gej *)main;
  secp256k1_ecmult_const_xonly_cold_2();
  psStack_208 = (secp256k1_gej *)d;
  psStack_200 = psVar217;
  uStack_1f8 = unaff_R13;
  psStack_1f0 = psVar194;
  psStack_1e8 = n;
  psStack_1e0 = psVar187;
  setbuf(_stdout,(char *)0x0);
  setbuf(_stderr,(char *)0x0);
  printf("Exhaustive tests for order %lu\n");
  uStack_1cd0 = (ulong)uVar180;
  psStack_1c90 = psVar208;
  if ((int)uVar180 < 2) {
    printf("test count = %i\n",(ulong)(uint)count);
  }
  else {
    uVar200 = strtol((char *)(psVar208->x).n[1],(char **)0x0,0);
    count = (int)uVar200;
    printf("test count = %i\n",uVar200 & 0xffffffff);
    if (uVar180 != 2) {
      pcVar221 = (char *)(psVar208->x).n[2];
      auStack_1390._0_8_ = 0;
      auStack_1390._8_8_ = 0;
      if ((pcVar221 != (char *)0x0) && (*pcVar221 != '\0')) {
        lVar201 = 0;
        do {
          uStack_1cd0._0_4_ = uVar180;
          if (pcVar221[1] == '\0') goto LAB_00115666;
          iVar179 = __isoc99_sscanf(pcVar221,"%2hx",auStack_9c0);
          if (iVar179 != 1) goto LAB_00115666;
          auStack_1390[lVar201] = auStack_9c0[0];
          if (lVar201 == 0xf) goto LAB_00115666;
          lVar201 = lVar201 + 1;
          pcVar1 = pcVar221 + 2;
          pcVar221 = pcVar221 + 2;
          if (*pcVar1 == '\0') goto LAB_00115666;
        } while( true );
      }
    }
  }
  auStack_1390._8_8_ = 0;
  auStack_1390._0_8_ = 0;
  __stream = fopen("/dev/urandom","rb");
  if ((__stream != (FILE *)0x0) && (sVar185 = fread(auStack_1390,1,0x10,__stream), sVar185 == 0x10))
  goto LAB_0011565e;
LAB_001179fe:
  main_cold_1();
  uVar180 = (uint)uStack_1cd0;
  if ((extraout_RAX & 1) == 0) {
LAB_0011565e:
    uStack_1cd0._0_4_ = uVar180;
    fclose(__stream);
  }
LAB_00115666:
  psStack_1c98 = (secp256k1_gej *)((ulong)auStack_1390._8_8_ >> 8 & 0xff);
  lVar201 = 0;
  printf("random seed = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n",
         auStack_1390._0_8_ & 0xff,(ulong)auStack_1390._0_8_ >> 8 & 0xff);
  auStack_9c0._0_8_ = 0xbb67ae856a09e667;
  auStack_9c0._8_8_ = 0xa54ff53a3c6ef372;
  auStack_9c0._16_8_ = 0x9b05688c510e527f;
  auStack_9c0._24_8_ = 0x5be0cd191f83d9ab;
  auStack_9c0._96_8_ = 0;
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_9c0,(uchar *)"secp256k1 test init",0x13);
  secp256k1_sha256_write((secp256k1_sha256 *)auStack_9c0,auStack_1390,0x10);
  puVar222 = auStack_f10;
  secp256k1_sha256_finalize((secp256k1_sha256 *)auStack_9c0,puVar222);
  psVar187 = psStack_1c90;
  do {
    lVar193 = 0;
    uVar200 = 0;
    do {
      uVar200 = (ulong)puVar222[lVar193] | uVar200 << 8;
      lVar193 = lVar193 + 1;
    } while (lVar193 != 8);
    secp256k1_test_state[lVar201] = uVar200;
    lVar201 = lVar201 + 1;
    puVar222 = puVar222 + 8;
  } while (lVar201 != 4);
  if (4 < (int)(uint)uStack_1cd0) {
    lVar201 = strtol((char *)(psStack_1c90->x).n[3],(char **)0x0,0);
    num_cores = (uint32_t)lVar201;
    uVar200 = strtol((char *)(psVar187->x).n[4],(char **)0x0,0);
    this_core = (uint32_t)uVar200;
    if (((ulong)num_cores == 0) || (num_cores <= this_core)) {
      main_cold_2();
      return 1;
    }
    printf("running tests for core %lu (out of [0..%lu])\n",uVar200 & 0xffffffff,
           (ulong)num_cores - 1);
  }
  a = (secp256k1_context *)0x1a000;
  psVar186 = (secp256k1_ge *)malloc(0x1a000);
  if (psVar186 != (secp256k1_ge *)0x0) {
    secp256k1_gej_set_ge((secp256k1_gej *)auStack_9c0,&secp256k1_ge_const_g);
    a = (secp256k1_context *)auStack_1690;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a,(uchar *)"The scalar for this x is unknown");
    if ((0xffffefffffc2e < (ulong)auStack_1690._0_8_) && (uStack_1670 == 0xffffffffffff)) {
      if ((auStack_1680._0_8_ & auStack_1680._8_8_ & auStack_1690._8_8_) == 0xfffffffffffff)
      goto LAB_00117aa6;
    }
    uStack_1668 = 0x100000001;
    secp256k1_fe_verify((secp256k1_fe *)auStack_1690);
    a = (secp256k1_context *)auStack_1390;
    iVar179 = secp256k1_ge_set_xo_var((secp256k1_ge *)a,(secp256k1_fe *)auStack_1690,0);
    if (iVar179 != 0) {
      secp256k1_gej_set_ge((secp256k1_gej *)auStack_f10,(secp256k1_ge *)auStack_1390);
      psVar194 = (secp256k1_fe *)0x0;
      secp256k1_gej_add_ge_var
                ((secp256k1_gej *)auStack_f10,(secp256k1_gej *)auStack_f10,&secp256k1_ge_const_g,
                 (secp256k1_fe *)0x0);
      a = (secp256k1_context *)0x26000;
      psVar187 = (secp256k1_gej *)malloc(0x26000);
      if (psVar187 != (secp256k1_gej *)0x0) {
        memcpy(auStack_1390,auStack_9c0,0x98);
        memcpy(auStack_1690,auStack_f10,0x98);
        lVar201 = 0;
        psVar208 = psVar187;
        do {
          memcpy(psVar187 + lVar201 * 0x10,auStack_1690,0x98);
          lVar193 = 0xf;
          psVar211 = psVar208;
          do {
            secp256k1_gej_add_var(psVar211 + 1,psVar211,(secp256k1_gej *)auStack_1390,psVar194);
            lVar193 = lVar193 + -1;
            psVar211 = psVar211 + 1;
          } while (lVar193 != 0);
          iVar179 = 4;
          do {
            secp256k1_gej_double_var
                      ((secp256k1_gej *)auStack_1390,(secp256k1_gej *)auStack_1390,
                       (secp256k1_fe *)0x0);
            iVar179 = iVar179 + -1;
          } while (iVar179 != 0);
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_1690,(secp256k1_gej *)auStack_1690,(secp256k1_fe *)0x0
                    );
          if (lVar201 == 0x3e) {
            secp256k1_gej_neg((secp256k1_gej *)auStack_1690,(secp256k1_gej *)auStack_1690);
            secp256k1_gej_add_var
                      ((secp256k1_gej *)auStack_1690,(secp256k1_gej *)auStack_1690,
                       (secp256k1_gej *)auStack_f10,psVar194);
          }
          lVar201 = lVar201 + 1;
          psVar208 = psVar208 + 0x10;
        } while (lVar201 != 0x40);
        lVar201 = -1;
        lVar218 = 0;
        lVar193 = 0;
        psVar220 = psVar186;
        do {
          secp256k1_gej_verify((secp256k1_gej *)((long)(psVar187->x).n + lVar218));
          if (*(int *)((long)(&psVar187->z + 1) + lVar218) == 0) {
            if (lVar201 == -1) {
              puVar203 = (uint64_t *)((long)(psVar187->z).n + lVar218);
              uVar216 = *puVar203;
              uVar214 = puVar203[1];
              auVar3 = *(undefined1 (*) [16])((long)(psVar187->z).n + lVar218 + 0x10);
              puVar2 = (undefined4 *)((long)(psVar187->z).n + lVar218 + 0x20);
              uVar190 = puVar2[1];
              iVar179 = puVar2[2];
              iVar205 = puVar2[3];
              *(undefined4 *)((psVar220->x).n + 4) = *puVar2;
              *(undefined4 *)((long)(psVar220->x).n + 0x24) = uVar190;
              (psVar220->x).magnitude = iVar179;
              (psVar220->x).normalized = iVar205;
              *(undefined1 (*) [16])((psVar220->x).n + 2) = auVar3;
              (psVar220->x).n[0] = uVar216;
              (psVar220->x).n[1] = uVar214;
              lVar201 = lVar193;
            }
            else {
              secp256k1_fe_mul(&psVar220->x,&psVar186[lVar201].x,
                               (secp256k1_fe *)((long)(psVar187->z).n + lVar218));
              lVar201 = lVar193;
            }
          }
          else {
            secp256k1_ge_set_infinity(psVar220);
          }
          lVar193 = lVar193 + 1;
          psVar220 = psVar220 + 1;
          lVar218 = lVar218 + 0x98;
        } while (lVar193 != 0x400);
        if (lVar201 != -1) {
          a = (secp256k1_context *)auStack_1990;
          secp256k1_fe_inv_var((secp256k1_fe *)a,&psVar186[lVar201].x);
          if (lVar201 == 0) {
            lVar201 = 0;
          }
          else {
            psVar220 = psVar186 + lVar201;
            piVar197 = &psVar187[lVar201 + -1].infinity;
            lVar193 = lVar201;
            do {
              lVar193 = lVar193 + -1;
              psVar220 = psVar220 + -1;
              if (*piVar197 == 0) {
                a = (secp256k1_context *)auStack_1990;
                secp256k1_fe_mul(&psVar186[lVar201].x,&psVar220->x,(secp256k1_fe *)a);
                secp256k1_fe_mul((secp256k1_fe *)a,(secp256k1_fe *)a,&psVar187[lVar201].z);
                lVar201 = lVar193;
              }
              piVar197 = piVar197 + -0x26;
            } while (lVar193 != 0);
          }
          if (psVar187[lVar201].infinity != 0) goto LAB_00117a83;
          auVar176[0xf] = uStack_1971;
          auVar176._0_15_ = auStack_1990._16_15_;
          puVar203 = psVar186[lVar201].x.n + 4;
          *(undefined4 *)puVar203 = auStack_1970._0_4_;
          *(undefined4 *)((long)puVar203 + 4) = auStack_1970._4_4_;
          *(int *)(puVar203 + 1) = iStack_1968;
          *(int *)((long)puVar203 + 0xc) = iStack_1964;
          *(undefined1 (*) [16])(psVar186[lVar201].x.n + 2) = auVar176;
          psVar186[lVar201].x.n[0] = CONCAT44(auStack_1990._4_4_,auStack_1990._0_4_);
          psVar186[lVar201].x.n[1] = CONCAT17(auStack_1990[0xf],auStack_1990._8_7_);
          lVar201 = 0;
          psVar208 = psVar187;
          do {
            if (psVar208->infinity == 0) {
              psVar220 = (secp256k1_ge *)((long)(psVar186->x).n + lVar201);
              secp256k1_ge_set_gej_zinv(psVar220,psVar208,(secp256k1_fe *)psVar220);
            }
            secp256k1_ge_verify((secp256k1_ge *)((long)(psVar186->x).n + lVar201));
            lVar201 = lVar201 + 0x68;
            psVar208 = psVar208 + 1;
          } while (lVar201 != 0x1a000);
        }
        free(psVar187);
        pasVar225 = secp256k1_ecmult_gen_prec_table;
        lVar201 = 0;
        psVar220 = psVar186;
        do {
          lVar193 = 0;
          a_00 = psVar220;
          do {
            secp256k1_ge_to_storage
                      ((secp256k1_ge_storage *)((long)(*pasVar225)[0].x.n + lVar193),a_00);
            lVar193 = lVar193 + 0x40;
            a_00 = a_00 + 1;
          } while (lVar193 != 0x400);
          lVar201 = lVar201 + 1;
          psVar220 = psVar220 + 0x10;
          pasVar225 = pasVar225 + 1;
        } while (lVar201 != 0x40);
        free(psVar186);
        secp256k1_gej_set_ge((secp256k1_gej *)auStack_9c0,&secp256k1_ge_const_g);
        secp256k1_ecmult_compute_table(secp256k1_pre_g,(int)(secp256k1_gej *)auStack_9c0,gen);
        iVar179 = 0x80;
        do {
          secp256k1_gej_double_var
                    ((secp256k1_gej *)auStack_9c0,(secp256k1_gej *)auStack_9c0,(secp256k1_fe *)0x0);
          iVar179 = iVar179 + -1;
        } while (iVar179 != 0);
        secp256k1_ecmult_compute_table(secp256k1_pre_g_128,(int)auStack_9c0,gen_00);
        iVar179 = count;
        while( true ) {
          count = iVar179 + -1;
          if (iVar179 == 0) {
            secp256k1_testrand256(auStack_1390);
            printf("random run = %02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x%02x\n"
                   ,auStack_1390._0_8_ & 0xff,(ulong)auStack_1390._0_8_ >> 8 & 0xff,
                   (ulong)auStack_1390._0_8_ >> 0x10 & 0xff,(ulong)auStack_1390._0_8_ >> 0x18 & 0xff
                   ,(ulong)auStack_1390._0_8_ >> 0x20 & 0xff,
                   (ulong)auStack_1390._0_8_ >> 0x28 & 0xff,(ulong)auStack_1390._0_8_ >> 0x30 & 0xff
                   ,(ulong)auStack_1390._0_8_ >> 0x38,auStack_1390._8_8_ & 0xff,
                   (ulong)auStack_1390._8_8_ >> 8 & 0xff,(ulong)auStack_1390._8_8_ >> 0x10 & 0xff,
                   (ulong)auStack_1390._8_8_ >> 0x18 & 0xff,(ulong)auStack_1390._8_8_ >> 0x20 & 0xff
                   ,(ulong)auStack_1390._8_8_ >> 0x28 & 0xff,
                   (ulong)auStack_1390._8_8_ >> 0x30 & 0xff,(ulong)auStack_1390._8_8_ >> 0x38);
            puts("no problems found");
            return 0;
          }
          ctx = secp256k1_context_create(1);
          secp256k1_testrand256(auStack_19b0);
          a = ctx;
          iVar179 = secp256k1_context_randomize(ctx,auStack_19b0);
          if (iVar179 == 0) break;
          secp256k1_gej_set_infinity((secp256k1_gej *)auStack_9c0);
          secp256k1_ge_set_gej((secp256k1_ge *)auStack_f10,(secp256k1_gej *)auStack_9c0);
          lVar201 = -0x4e0;
          sVar204 = 1;
          psVar187 = (secp256k1_gej *)auStack_9c0;
          do {
            psVar208 = psVar187 + 1;
            secp256k1_gej_add_ge(psVar208,psVar187,&secp256k1_ge_const_g);
            secp256k1_ge_set_gej((secp256k1_ge *)(auStack_9c8 + lVar201),psVar208);
            if (count != 0) {
              random_fe((secp256k1_fe *)auStack_1390);
              secp256k1_gej_rescale(psVar208,(secp256k1_fe *)auStack_1390);
            }
            auStack_1990._0_4_ = sVar204;
            secp256k1_ecmult_gen
                      (&ctx->ecmult_gen_ctx,(secp256k1_gej *)auStack_1390,
                       (secp256k1_scalar *)auStack_1990);
            psVar202 = (secp256k1_context *)auStack_1690;
            secp256k1_ge_set_gej((secp256k1_ge *)psVar202,(secp256k1_gej *)auStack_1390);
            if (*(int *)(auStack_9c0 + lVar201 + 0x58) != 0) goto LAB_00117a56;
            a = psVar202;
            if (iStack_1630 != 0) goto LAB_00117a5b;
            a = (secp256k1_context *)auStack_1690;
            iVar179 = secp256k1_fe_equal_var
                                ((secp256k1_fe *)a,(secp256k1_fe *)(auStack_9c8 + lVar201));
            if (iVar179 == 0) goto LAB_00117a60;
            a = (secp256k1_context *)auStack_1660;
            iVar179 = secp256k1_fe_equal_var
                                ((secp256k1_fe *)a,(secp256k1_fe *)(auStack_9c0 + lVar201 + 0x28));
            if (iVar179 == 0) goto LAB_00117a65;
            sVar204 = sVar204 + 1;
            lVar201 = lVar201 + 0x68;
            psVar187 = psVar208;
          } while (lVar201 != 0);
          uVar200 = 0;
          puVar226 = auStack_f10;
          lVar201 = 0;
          do {
            secp256k1_ge_mul_lambda
                      ((secp256k1_ge *)auStack_1390,(secp256k1_ge *)(auStack_f10 + lVar201));
            ge_equals_ge((secp256k1_ge *)(puVar226 + (uVar200 / 0xd) * -0x548),
                         (secp256k1_ge *)auStack_1390);
            lVar201 = lVar201 + 0x68;
            puVar226 = puVar226 + 0x3a8;
            uVar200 = uVar200 + 9;
          } while (lVar201 != 0x548);
          a = (secp256k1_context *)auStack_f10;
          secp256k1_ge_verify((secp256k1_ge *)a);
          if (auStack_f10._96_4_ == 0) goto LAB_00117a8d;
          a = (secp256k1_context *)auStack_9c0;
          secp256k1_gej_verify((secp256k1_gej *)a);
          if (auStack_9c0._144_4_ == 0) goto LAB_00117a92;
          lVar201 = 0xc;
          psVar202 = (secp256k1_context *)(auStack_f10 + 0x68);
          a_01 = (secp256k1_context *)(auStack_9c0 + 0x98);
          do {
            a = psVar202;
            secp256k1_ge_verify((secp256k1_ge *)psVar202);
            if ((psVar202->ecmult_gen_ctx).initial.y.magnitude != 0) goto LAB_00117a6a;
            a = a_01;
            secp256k1_gej_verify((secp256k1_gej *)a_01);
            if ((a_01->ecmult_gen_ctx).initial.z.magnitude != 0) goto LAB_00117a6f;
            a_01 = (secp256k1_context *)&(a_01->ecmult_gen_ctx).initial.infinity;
            psVar202 = (secp256k1_context *)&(psVar202->ecmult_gen_ctx).initial.z;
            lVar201 = lVar201 + -1;
          } while (lVar201 != 0);
          puVar226 = auStack_f10;
          psStack_1cc8 = (secp256k1_scalar *)0x0;
          uStack_1cc0 = 0;
          do {
            if (((ulong)num_cores == 1) ||
               (uStack_1cc0 = uStack_1cc0 + 0xe7037ed1a0b428db,
               (uint32_t)
               ((uStack_1cc0 >> 0x20 ^ uStack_1cc0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
               this_core)) {
              lVar201 = (long)psStack_1cc8 * 0x98;
              secp256k1_fe_inv((secp256k1_fe *)auStack_1990,
                               (secp256k1_fe *)(auStack_9c0 + (long)psStack_1cc8 * 0x98 + 0x60));
              lVar193 = 0;
              puVar206 = puVar226;
              psVar227 = psStack_1cc8;
              do {
                psVar186 = (secp256k1_ge *)(puVar206 + ((ulong)psVar227 / 0xd) * -0x548);
                psVar187 = (secp256k1_gej *)(auStack_9c0 + lVar193);
                secp256k1_gej_add_var
                          ((secp256k1_gej *)auStack_1390,psVar187,
                           (secp256k1_gej *)(auStack_9c0 + (long)psStack_1cc8 * 0x98),
                           (secp256k1_fe *)0x4ec4ec4ec4ec4ec5);
                ge_equals_gej(psVar186,(secp256k1_gej *)auStack_1390);
                if (psStack_1cc8 != (secp256k1_scalar *)0x0) {
                  secp256k1_gej_add_ge
                            ((secp256k1_gej *)auStack_1390,psVar187,
                             (secp256k1_ge *)(auStack_f10 + (long)psStack_1cc8 * 0x68));
                  ge_equals_gej(psVar186,(secp256k1_gej *)auStack_1390);
                }
                secp256k1_gej_add_ge_var
                          ((secp256k1_gej *)auStack_1390,psVar187,
                           (secp256k1_ge *)(auStack_f10 + (long)psStack_1cc8 * 0x68),
                           (secp256k1_fe *)0x0);
                ge_equals_gej(psVar186,(secp256k1_gej *)auStack_1390);
                iStack_1630 = (&asStack_928[-1].declassify)[(long)psStack_1cc8 * 0x26];
                uStack_1670 = *(uint64_t *)(auStack_9c0 + lVar201 + 0x20);
                uStack_1668 = *(uint64_t *)(auStack_9c0 + lVar201 + 0x28);
                auStack_1680._8_8_ = *(undefined8 *)(auStack_9c0 + lVar201 + 0x18);
                auStack_1680._0_8_ = *(undefined8 *)(auStack_9c0 + (long)psStack_1cc8 * 0x98 + 0x10)
                ;
                auStack_1690._8_8_ = *(undefined8 *)(auStack_9c0 + (long)psStack_1cc8 * 0x98 + 8);
                auStack_1690._0_8_ =
                     (((secp256k1_gej *)(auStack_9c0 + (long)psStack_1cc8 * 0x98))->x).n[0];
                auStack_1660._0_8_ = *(undefined8 *)(auStack_9c0 + lVar201 + 0x30);
                auStack_1660._8_8_ = *(undefined8 *)(auStack_9c0 + lVar201 + 0x38);
                auStack_1660._16_16_ = *(undefined1 (*) [16])(auStack_9c0 + lVar201 + 0x40);
                uStack_1640 = (undefined4)
                              (&asStack_928[0].ecmult_gen_ctx.initial)[(long)psStack_1cc8 - 1].y.n
                              [3];
                uStack_163c = *(undefined4 *)
                               ((long)(&asStack_928[0].ecmult_gen_ctx.initial)
                                      [(long)psStack_1cc8 - 1].y.n + 0x1c);
                iStack_1638 = (int)(&asStack_928[0].ecmult_gen_ctx.initial)[(long)psStack_1cc8 - 1].
                                   y.n[4];
                iStack_1634 = *(int *)((long)(&asStack_928[0].ecmult_gen_ctx.initial)
                                             [(long)psStack_1cc8 - 1].y.n + 0x24);
                secp256k1_gej_add_zinv_var
                          ((secp256k1_gej *)auStack_1390,psVar187,(secp256k1_ge *)auStack_1690,
                           (secp256k1_fe *)auStack_1990);
                ge_equals_gej(psVar186,(secp256k1_gej *)auStack_1390);
                lVar193 = lVar193 + 0x98;
                puVar206 = puVar206 + 0x68;
                psVar227 = (secp256k1_scalar *)((long)psVar227 + 1);
              } while (lVar193 != 0x7b8);
            }
            psStack_1cc8 = (secp256k1_scalar *)((long)psStack_1cc8 + 1);
            puVar226 = puVar226 + 0x68;
          } while (psStack_1cc8 != (secp256k1_scalar *)0xd);
          psVar187 = (secp256k1_gej *)auStack_9c0;
          uVar180 = 0;
          uVar200 = 0;
          do {
            secp256k1_gej_double((secp256k1_gej *)auStack_1390,psVar187);
            uVar191 = uVar180 - 0xd;
            if (uVar200 < 7) {
              uVar191 = uVar180;
            }
            ge_equals_gej((secp256k1_ge *)(auStack_f10 + (ulong)uVar191 * 0x68),
                          (secp256k1_gej *)auStack_1390);
            secp256k1_gej_double_var((secp256k1_gej *)auStack_1390,psVar187,(secp256k1_fe *)0x0);
            ge_equals_gej((secp256k1_ge *)(auStack_f10 + (ulong)uVar191 * 0x68),
                          (secp256k1_gej *)auStack_1390);
            uVar200 = uVar200 + 1;
            uVar180 = uVar180 + 2;
            psVar187 = psVar187 + 1;
          } while (uVar200 != 0xd);
          lVar201 = 0x68;
          psVar186 = &sStack_a30;
          psVar187 = (secp256k1_gej *)(auStack_9c0 + 0x98);
          do {
            secp256k1_ge_neg((secp256k1_ge *)auStack_1690,(secp256k1_ge *)(auStack_f10 + lVar201));
            ge_equals_ge(psVar186,(secp256k1_ge *)auStack_1690);
            secp256k1_gej_neg((secp256k1_gej *)auStack_1390,psVar187);
            ge_equals_gej(psVar186,(secp256k1_gej *)auStack_1390);
            lVar201 = lVar201 + 0x68;
            psVar187 = psVar187 + 1;
            psVar186 = psVar186 + -1;
          } while (lVar201 != 0x548);
          lVar201 = 1;
          na = (_func_void_char_ptr_void_ptr *)0x68;
          uStack_1cb0 = 0;
          do {
            uVar200 = 0;
            puVar226 = auStack_f10;
            do {
              if (((ulong)num_cores == 1) ||
                 (uStack_1cb0 = uStack_1cb0 + 0xe7037ed1a0b428db,
                 (uint32_t)
                 ((uStack_1cb0 >> 0x20 ^ uStack_1cb0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                iVar179 = 0;
                puVar206 = puVar226;
                uVar215 = uVar200;
                do {
                  auStack_1bf0._0_4_ = iVar179;
                  auStack_1c20._0_4_ = (int)uVar200;
                  auStack_1c70._8_8_ = auStack_1690;
                  auStack_1c70._0_8_ = auStack_1990;
                  auStack_1c60._0_8_ = auStack_1390;
                  secp256k1_ecmult_strauss_wnaf
                            ((secp256k1_strauss_state *)auStack_1c70,(secp256k1_gej *)auStack_1b30,1
                             ,(secp256k1_gej *)(auStack_9c0 + lVar201 * 0x98),
                             (secp256k1_scalar *)auStack_1bf0,(secp256k1_scalar *)auStack_1c20);
                  ge_equals_gej((secp256k1_ge *)(puVar206 + (uVar215 / 0xd) * -0x548),
                                (secp256k1_gej *)auStack_1b30);
                  iVar179 = iVar179 + 1;
                  puVar206 = puVar206 + (long)na;
                  uVar215 = uVar215 + lVar201;
                } while (iVar179 != 0xd);
              }
              uVar200 = uVar200 + 1;
              puVar226 = puVar226 + 0x68;
            } while ((int)uVar200 != 0xd);
            lVar201 = lVar201 + 1;
            na = na + 0x68;
          } while (lVar201 != 0xd);
          uStack_1cd0 = 0;
          do {
            lVar201 = 0;
            do {
              if (((ulong)num_cores == 1) ||
                 (uStack_1cb0 = uStack_1cb0 + 0xe7037ed1a0b428db,
                 (uint32_t)
                 ((uStack_1cb0 >> 0x20 ^ uStack_1cb0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                auStack_1c70._0_4_ = (int)uStack_1cd0;
                psVar186 = (secp256k1_ge *)(auStack_f10 + lVar201 * 0x68);
                secp256k1_ecmult_const
                          ((secp256k1_gej *)auStack_1390,psVar186,(secp256k1_scalar *)auStack_1c70);
                uVar180 = (int)lVar201 * (int)uStack_1cd0;
                __stream = (FILE *)(auStack_f10 +
                                   (ulong)(uVar180 - (uVar180 / 0xd + (uVar180 / 0xd) * 0xc)) * 0x68
                                   );
                ge_equals_gej((secp256k1_ge *)__stream,(secp256k1_gej *)auStack_1390);
                if (lVar201 != 0 && uStack_1cd0 != 0) {
                  a = (secp256k1_context *)auStack_1b30;
                  psVar202 = a;
                  iVar179 = secp256k1_ecmult_const_xonly
                                      ((secp256k1_fe *)a,(secp256k1_fe *)psVar186,
                                       (secp256k1_fe *)0x0,(secp256k1_scalar *)auStack_1c70,0);
                  if (iVar179 == 0) goto LAB_00117a3d;
                  iVar179 = secp256k1_fe_equal_var((secp256k1_fe *)a,(secp256k1_fe *)__stream);
                  psVar202 = a;
                  if (iVar179 == 0) goto LAB_00117a42;
                  iVar179 = -0xb;
                  do {
                    iVar179 = iVar179 + 1;
                    if (iVar179 == 0) goto LAB_00117a79;
                    a = (secp256k1_context *)auStack_1990;
                    random_fe((secp256k1_fe *)a);
                    secp256k1_fe_normalize((secp256k1_fe *)a);
                    secp256k1_fe_verify((secp256k1_fe *)a);
                    if (iStack_1964 == 0) {
                      main_cold_40();
                      goto LAB_001179fe;
                    }
                    auVar177[0xf] = uStack_1971;
                    auVar177._0_15_ = auStack_1990._16_15_;
                    auVar175._4_4_ = auStack_1990._4_4_;
                    auVar175._0_4_ = auStack_1990._0_4_;
                    auVar175._8_7_ = auStack_1990._8_7_;
                    auVar175[0xf] = auStack_1990[0xf];
                  } while ((SUB168(auVar177 | auVar175,8) == 0 && SUB168(auVar177 | auVar175,0) == 0
                           ) && CONCAT44(auStack_1970._4_4_,auStack_1970._0_4_) == 0);
                  secp256k1_fe_mul((secp256k1_fe *)auStack_1690,(secp256k1_fe *)auStack_1990,
                                   (secp256k1_fe *)psVar186);
                  na = (_func_void_char_ptr_void_ptr *)0x0;
                  psVar202 = (secp256k1_context *)auStack_1b30;
                  iVar179 = secp256k1_ecmult_const_xonly
                                      ((secp256k1_fe *)auStack_1b30,(secp256k1_fe *)auStack_1690,
                                       (secp256k1_fe *)auStack_1990,(secp256k1_scalar *)auStack_1c70
                                       ,0);
                  if (iVar179 == 0) goto LAB_00117a47;
                  iVar179 = secp256k1_fe_equal_var
                                      ((secp256k1_fe *)auStack_1b30,(secp256k1_fe *)__stream);
                  psVar202 = (secp256k1_context *)auStack_1390;
                  if (iVar179 == 0) goto LAB_00117a4c;
                }
              }
              lVar201 = lVar201 + 1;
            } while (lVar201 != 0xd);
            uStack_1cd0 = uStack_1cd0 + 1;
          } while (uStack_1cd0 != 0xd);
          psStack_1c78 = &ctx->error_callback;
          scratch = secp256k1_scratch_create(psStack_1c78,0x1000);
          lStack_1c88 = 0;
          auStack_1bf0._56_8_ = (void *)0x0;
          auStack_1bf0._64_8_ = scratch;
          do {
            uVar216 = 0;
            do {
              lStack_1c80 = 0;
              uStack_1b78 = uVar216;
              do {
                uVar214 = 0;
                do {
                  if ((ulong)num_cores == 1) {
LAB_00116623:
                    puStack_1b68 = (undefined8 *)(auStack_f10 + uVar214 * 0x68);
                    uStack_1b80 = uVar214;
                    uStack_1b70 = uVar214 * lStack_1c88 + lStack_1c80;
                    lVar201 = 0;
                    do {
                      auStack_1390._0_8_ = CONCAT44((int)uVar216,(int)lStack_1c88);
                      auStack_1bf0._0_4_ = (int)lStack_1c80;
                      puVar209 = puStack_1b68;
                      puVar213 = (undefined8 *)(auStack_1390 + 8);
                      for (lVar193 = 0xd; lVar193 != 0; lVar193 = lVar193 + -1) {
                        *puVar213 = *puVar209;
                        puVar209 = puVar209 + (ulong)bVar229 * -2 + 1;
                        puVar213 = puVar213 + (ulong)bVar229 * -2 + 1;
                      }
                      lStack_1b60 = lVar201;
                      puVar209 = (undefined8 *)(auStack_f10 + lVar201 * 0x68);
                      puVar213 = auStack_1320;
                      for (pvVar195 = (void *)0xd; pvVar195 != (void *)0x0;
                          pvVar195 = (void *)((long)pvVar195 + -1)) {
                        *puVar213 = *puVar209;
                        puVar209 = puVar209 + (ulong)bVar229 * -2 + 1;
                        puVar213 = puVar213 + (ulong)bVar229 * -2 + 1;
                      }
                      secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1990);
                      if (scratch == (secp256k1_scratch *)0x0) {
                        secp256k1_ecmult_multi_simple_var
                                  ((secp256k1_gej *)auStack_1990,(secp256k1_scalar *)auStack_1bf0,
                                   (secp256k1_ecmult_multi_callback *)auStack_1390,pvVar195,
                                   (size_t)na);
                      }
                      else {
                        lVar201 = 0;
                        do {
                          if (scratch->magic[lVar201] != "scratch"[lVar201]) {
                            (*(ctx->error_callback).fn)
                                      ("invalid scratch space",(ctx->error_callback).data);
                            uVar200 = 0;
                            goto LAB_00116739;
                          }
                          lVar201 = lVar201 + 1;
                        } while (lVar201 != 8);
                        uVar215 = scratch->max_size - scratch->alloc_size;
                        uVar200 = 0;
                        if (0x59 < uVar215) {
                          uVar200 = uVar215 - 0x5a;
                        }
LAB_00116739:
                        pvVar195 = (void *)0x1;
                        na = (_func_void_char_ptr_void_ptr *)&DAT_0012a180;
                        uVar215 = 0;
                        do {
                          if (pvVar195 == (void *)0xd) break;
                          if (pvVar195 < (void *)0xd) {
                            uVar199 = *(ulong *)na;
                          }
                          else {
                            uVar199 = 0;
                          }
                          uVar184 = (ulong)(byte)(((short)pvVar195 - 0x80U & 0xff) /
                                                 (ushort)(byte)((byte)pvVar195 + 1));
                          uVar198 = (0x98L << ((byte)pvVar195 & 0x3f)) + uVar184 * 8 + 0x110;
                          if (uVar200 < uVar198) break;
                          uVar198 = (uVar200 - uVar198) / (uVar184 * 8 + 0x100);
                          uVar184 = uVar199;
                          if (uVar198 < uVar199) {
                            uVar184 = uVar198;
                          }
                          if (uVar215 < uVar184) {
                            uVar215 = uVar184;
                          }
                          na = na + 8;
                          pvVar195 = (void *)((long)pvVar195 + 1);
                        } while (uVar199 <= uVar198);
                        if (uVar215 != 0) {
                          lVar201 = 0;
                          do {
                            pvVar195 = (void *)CONCAT71((int7)((ulong)pvVar195 >> 8),
                                                        scratch->magic[lVar201]);
                            if (scratch->magic[lVar201] != "scratch"[lVar201]) {
                              (*(ctx->error_callback).fn)
                                        ("invalid scratch space",(ctx->error_callback).data);
                              goto LAB_00116ac9;
                            }
                            lVar201 = lVar201 + 1;
                          } while (lVar201 != 8);
                          uVar200 = scratch->max_size - scratch->alloc_size;
                          pvVar195 = (void *)0x0;
                          if (0x4a < uVar200) {
                            pvVar195 = (void *)(uVar200 - 0x4b);
                          }
                          if ((void *)0x70b < pvVar195) {
                            uStack_1c30 = (long)pvVar195 - 0xe18;
                            psStack_1c98 = (secp256k1_gej *)
                                           (ulong)(uStack_1c30 < 0xfffffffffffff8f4);
                            psStack_1c90 = (secp256k1_gej *)((long)(psStack_1c98->x).n + 1);
                            psVar187 = (secp256k1_gej *)0x2;
                            bVar189 = 0;
                            psStack_1cc8 = (secp256k1_scalar *)auStack_1bf0;
                            lVar201 = 0;
                            do {
                              psVar208 = psStack_1c90;
                              if (psVar187 < psStack_1c90) {
                                psVar208 = psVar187;
                              }
                              lVar201 = lVar201 << ((byte)psStack_1c98 & 0x3f);
                              lVar193 = 0;
                              psVar211 = psStack_1c98;
                              do {
                                psVar211 = (secp256k1_gej *)
                                           CONCAT71((int7)((ulong)psVar211 >> 8),
                                                    scratch->magic[lVar193]);
                                if (scratch->magic[lVar193] != "scratch"[lVar193]) {
                                  (*(ctx->error_callback).fn)
                                            ("invalid scratch space",(ctx->error_callback).data);
                                  sVar219 = 0;
                                  goto LAB_00116884;
                                }
                                lVar193 = lVar193 + 1;
                              } while (lVar193 != 8);
                              sVar219 = scratch->alloc_size;
LAB_00116884:
                              secp256k1_gej_set_infinity((secp256k1_gej *)auStack_1690);
                              error_callback = psStack_1c78;
                              if (psVar187 != (secp256k1_gej *)0x0 ||
                                  psStack_1cc8 != (secp256k1_scalar *)0x0) {
                                auStack_1bf0._72_8_ = sVar219;
                                psVar211 = (secp256k1_gej *)
                                           secp256k1_scratch_alloc
                                                     (psStack_1c78,scratch,(long)psVar208 * 0x98);
                                p_Stack_1b50 = (_func_void_char_ptr_void_ptr *)
                                               secp256k1_scratch_alloc
                                                         (error_callback,scratch,(long)psVar208 * 4)
                                ;
                                psVar196 = scratch;
                                pvStack_1b58 = secp256k1_scratch_alloc
                                                         (error_callback,scratch,
                                                          (long)psVar208 * 0xc0);
                                uVar190 = SUB84(psVar196,0);
                                auStack_1c70._0_8_ = pvStack_1b58;
                                pvVar195 = secp256k1_scratch_alloc
                                                     (error_callback,scratch,(long)psVar208 * 0x1a0)
                                ;
                                auStack_1c70._8_8_ = pvVar195;
                                pvVar188 = secp256k1_scratch_alloc
                                                     (error_callback,scratch,(long)psVar208 * 0x410)
                                ;
                                na = p_Stack_1b50;
                                scratch = (secp256k1_scratch *)auStack_1bf0._64_8_;
                                auStack_1c60._0_8_ = pvVar188;
                                auVar230._0_4_ =
                                     -(uint)((int)psVar211 == 0 &&
                                            (int)((ulong)psVar211 >> 0x20) == 0);
                                auVar230._4_4_ =
                                     -(uint)((int)p_Stack_1b50 == 0 &&
                                            (int)((ulong)p_Stack_1b50 >> 0x20) == 0);
                                auVar230._8_4_ =
                                     -(uint)((int)pvStack_1b58 == 0 &&
                                            (int)((ulong)pvStack_1b58 >> 0x20) == 0);
                                auVar230._12_4_ =
                                     -(uint)((int)pvVar195 == 0 &&
                                            (int)((ulong)pvVar195 >> 0x20) == 0);
                                iVar179 = movmskps(uVar190,auVar230);
                                if ((iVar179 != 0) || (pvVar188 == (void *)0x0)) {
                                  secp256k1_scratch_apply_checkpoint
                                            (psStack_1c78,(secp256k1_scratch *)auStack_1bf0._64_8_,
                                             auStack_1bf0._72_8_);
                                  break;
                                }
                                if (psVar187 != (secp256k1_gej *)0x0) {
                                  puVar203 = (uint64_t *)(auStack_1390 + lVar201 * 0x68 + 8);
                                  psVar207 = (secp256k1_gej *)0x0;
                                  r_00 = psVar211;
                                  do {
                                    *(undefined4 *)(na + (long)psVar207 * 4) =
                                         *(undefined4 *)
                                          (auStack_1390 + (long)psVar207 * 4 + lVar201 * 4);
                                    puVar210 = puVar203;
                                    psVar186 = (secp256k1_ge *)auStack_1b30;
                                    for (lVar193 = 0xd; lVar193 != 0; lVar193 = lVar193 + -1) {
                                      (psVar186->x).n[0] = *puVar210;
                                      puVar210 = puVar210 + (ulong)bVar229 * -2 + 1;
                                      psVar186 = (secp256k1_ge *)
                                                 ((long)psVar186 + (ulong)bVar229 * -0x10 + 8);
                                    }
                                    secp256k1_gej_set_ge(r_00,(secp256k1_ge *)auStack_1b30);
                                    psVar207 = (secp256k1_gej *)((long)(psVar207->x).n + 1);
                                    r_00 = r_00 + 1;
                                    puVar203 = puVar203 + 0xd;
                                  } while (psVar208 != psVar207);
                                }
                                secp256k1_ecmult_strauss_wnaf
                                          ((secp256k1_strauss_state *)auStack_1c70,
                                           (secp256k1_gej *)auStack_1690,(size_t)psVar208,psVar211,
                                           (secp256k1_scalar *)na,psStack_1cc8);
                                scratch = (secp256k1_scratch *)auStack_1bf0._64_8_;
                                secp256k1_scratch_apply_checkpoint
                                          (psStack_1c78,(secp256k1_scratch *)auStack_1bf0._64_8_,
                                           auStack_1bf0._72_8_);
                              }
                              bVar228 = 0xfffffffffffff8f3 < uStack_1c30;
                              secp256k1_gej_add_var
                                        ((secp256k1_gej *)auStack_1990,(secp256k1_gej *)auStack_1990
                                         ,(secp256k1_gej *)auStack_1690,&psVar211->x);
                              psVar187 = (secp256k1_gej *)((long)psVar187 - (long)psVar208);
                              bVar178 = bVar189 ^ 1;
                              lVar201 = 1;
                              psStack_1cc8 = (secp256k1_scalar *)0x0;
                              bVar189 = 1;
                            } while ((bool)(bVar228 & bVar178));
                            goto LAB_00116ae6;
                          }
                        }
LAB_00116ac9:
                        secp256k1_ecmult_multi_simple_var
                                  ((secp256k1_gej *)auStack_1990,(secp256k1_scalar *)auStack_1bf0,
                                   (secp256k1_ecmult_multi_callback *)auStack_1390,pvVar195,
                                   (size_t)na);
                      }
LAB_00116ae6:
                      lVar201 = lStack_1b60;
                      uVar216 = uStack_1b78;
                      uVar180 = (int)lStack_1b60 * (int)uStack_1b78 + (int)uStack_1b70;
                      ge_equals_gej((secp256k1_ge *)
                                    (auStack_f10 +
                                    (ulong)(uVar180 - (uVar180 / 0xd + (uVar180 / 0xd) * 0xc)) *
                                    0x68),(secp256k1_gej *)auStack_1990);
                      lVar201 = lVar201 + 1;
                      uVar214 = uStack_1b80;
                    } while (lVar201 != 0xd);
                  }
                  else {
                    auStack_1bf0._56_8_ = auStack_1bf0._56_8_ + 0xe7037ed1a0b428db;
                    if ((uint32_t)
                        (((ulong)auStack_1bf0._56_8_ >> 0x20 ^ auStack_1bf0._56_8_ & 0xffffffff) *
                         (ulong)num_cores >> 0x20) == this_core) goto LAB_00116623;
                  }
                  uVar214 = uVar214 + 1;
                } while (uVar214 != 0xd);
                lStack_1c80 = lStack_1c80 + 1;
              } while (lStack_1c80 != 0xd);
              uVar216 = uVar216 + 1;
            } while (uVar216 != 0xd);
            lStack_1c88 = lStack_1c88 + 1;
          } while (lStack_1c88 != 0xd);
          secp256k1_scratch_destroy(psStack_1c78,scratch);
          iVar179 = 1;
          uVar200 = 0;
          do {
            iVar205 = 1;
            do {
              if (((ulong)num_cores == 1) ||
                 (uVar200 = uVar200 + 0xe7037ed1a0b428db,
                 (uint32_t)((uVar200 >> 0x20 ^ uVar200 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                auStack_1b30._0_4_ = 1;
                iVar224 = 1;
                do {
                  auStack_1690 = (undefined1  [16])0x0;
                  auStack_1680._0_15_ = SUB1615((undefined1  [16])0x0,0);
                  auStack_1680[0xf] = (char)iVar205;
                  auStack_1990._16_15_ = SUB1615((undefined1  [16])0x0,0);
                  auStack_1990._0_4_ = 0;
                  auStack_1990._4_4_ = 0;
                  auStack_1990[8] = '\0';
                  auStack_1990[9] = '\0';
                  auStack_1990[10] = '\0';
                  auStack_1990[0xb] = '\0';
                  auStack_1990[0xc] = '\0';
                  auStack_1990[0xd] = '\0';
                  auStack_1990[0xe] = '\0';
                  auStack_1990[0xf] = '\0';
                  uStack_1971 = (uchar)iVar179;
                  psVar202 = ctx;
                  iVar181 = secp256k1_ecdsa_sign
                                      (ctx,(secp256k1_ecdsa_signature *)auStack_1390,auStack_1990,
                                       auStack_1690,secp256k1_nonce_function_smallint,auStack_1b30);
                  if (iVar181 != 1) {
                    main_cold_8();
LAB_00117a38:
                    main_cold_9();
                    goto LAB_00117a3d;
                  }
                  lVar201 = 0;
                  uVar180 = 0;
                  do {
                    uVar191 = (uint)(byte)auStack_1390[lVar201] | uVar180 << 8;
                    uVar180 = uVar191 - (uVar191 / 0xd + (uVar191 / 0xd) * 0xc);
                    if (uVar191 < 0xd) {
                      uVar180 = uVar191;
                    }
                    lVar201 = lVar201 + 1;
                  } while (lVar201 != 0x20);
                  uVar191 = 0;
                  lVar201 = 0x20;
                  do {
                    uVar192 = (uint)(byte)auStack_1390[lVar201] | uVar191 << 8;
                    uVar191 = uVar192 - (uVar192 / 0xd + (uVar192 / 0xd) * 0xc);
                    if (uVar192 < 0xd) {
                      uVar191 = uVar192;
                    }
                    lVar201 = lVar201 + 1;
                  } while (lVar201 != 0x40);
                  psVar202 = (secp256k1_context *)auStack_1c70;
                  r_from_k((secp256k1_scalar *)psVar202,(secp256k1_ge *)auStack_f10,
                           auStack_1b30._0_4_,(int *)(ulong)uVar192);
                  if (uVar180 != auStack_1c70._0_4_) goto LAB_00117a38;
                  uVar190 = auStack_1b30._0_4_;
                  uVar192 = auStack_1b30._0_4_ * uVar191;
                  uVar180 = uVar180 * iVar205 + iVar179;
                  iVar181 = uVar180 - (uVar180 / 0xd + (uVar180 / 0xd) * 0xc);
                  if ((uVar192 - (uVar192 / 0xd + (uVar192 / 0xd) * 0xc) != iVar181) &&
                     (uVar180 = (0xd - uVar191) * auStack_1b30._0_4_,
                     uVar180 - (uVar180 / 0xd + (uVar180 / 0xd) * 0xc) != iVar181))
                  goto LAB_00117a51;
                  if ((int)auStack_1b30._0_4_ < iVar224) break;
                  iVar224 = auStack_1b30._0_4_ + 1;
                  auStack_1b30._0_4_ = iVar224;
                } while ((int)uVar190 < 0xc);
              }
              iVar205 = iVar205 + 1;
            } while (iVar205 != 0xd);
            iVar179 = iVar179 + 1;
          } while (iVar179 != 0xd);
          uVar180 = 1;
          uStack_1cd0._0_4_ = -1;
          uStack_1cc0 = 0;
          uVar182 = num_cores;
          do {
            uVar200 = 1;
            iVar179 = 2;
            do {
              psStack_1c98 = (secp256k1_gej *)CONCAT44(psStack_1c98._4_4_,1);
              uStack_1c30 = CONCAT44(uStack_1c30._4_4_,iVar179);
              do {
                lVar201 = 1;
                uVar215 = uVar200 & 0xffffffff;
                psStack_1c90 = (secp256k1_gej *)CONCAT44(psStack_1c90._4_4_,iVar179);
                do {
                  if ((uVar182 == 1) ||
                     (uStack_1cc0 = uStack_1cc0 + 0xe7037ed1a0b428db,
                     (uint32_t)
                     ((ulong)uVar182 * (uStack_1cc0 >> 0x20 ^ uStack_1cc0 & 0xffffffff) >> 0x20) ==
                     this_core)) {
                    uVar191 = iVar179 - ((int)(uVar215 / 0xd) + (int)(uVar215 / 0xd) * 0xc);
                    piVar197 = (int *)(ulong)((uVar191 / 0xd) * 3);
                    iVar224 = uVar191 - (uVar191 / 0xd + (uVar191 / 0xd) * 0xc);
                    uVar199 = 0;
                    uVar191 = 0;
                    iVar205 = 0;
                    do {
                      r_from_k((secp256k1_scalar *)auStack_1390,(secp256k1_ge *)auStack_f10,iVar205,
                               piVar197);
                      if (uVar200 == (auStack_1390._0_8_ & 0xffffffff)) {
                        bVar228 = (int)(uVar199 / 0xd) + (int)(uVar199 / 0xd) * 0xc + iVar224 == 0;
                        piVar197 = (int *)(ulong)bVar228;
                        uVar191 = uVar191 | bVar228;
                      }
                      iVar205 = iVar205 + 1;
                      iVar224 = iVar224 + (uint)uStack_1cd0;
                      uVar199 = (ulong)((int)uVar199 + uVar180);
                    } while (iVar205 != 0xd);
                    auStack_1990._16_15_ = SUB1615((undefined1  [16])0x0,1);
                    auStack_1990._0_4_ = 0;
                    auStack_1990._4_4_ = 0;
                    auStack_1990[8] = '\0';
                    auStack_1990[9] = '\0';
                    auStack_1990[10] = '\0';
                    auStack_1990[0xb] = '\0';
                    auStack_1990[0xc] = '\0';
                    auStack_1990[0xd] = '\0';
                    auStack_1990[0xe] = '\0';
                    auStack_1990[0xf] = '\0';
                    uStack_1971 = (uchar)uVar200;
                    auStack_1960 = SUB1615((undefined1  [16])0x0,1);
                    auStack_1970[0] = '\0';
                    auStack_1970[1] = '\0';
                    auStack_1970[2] = '\0';
                    auStack_1970[3] = '\0';
                    auStack_1970[4] = '\0';
                    auStack_1970[5] = '\0';
                    auStack_1970[6] = '\0';
                    auStack_1970[7] = '\0';
                    iStack_1968 = 0;
                    iStack_1964 = 0;
                    uStack_1951 = (uchar)uVar180;
                    puVar203 = (uint64_t *)(auStack_f10 + lVar201 * 0x68);
                    psVar186 = (secp256k1_ge *)auStack_1390;
                    for (lVar193 = 0xd; lVar193 != 0; lVar193 = lVar193 + -1) {
                      (psVar186->x).n[0] = *puVar203;
                      puVar203 = puVar203 + (ulong)bVar229 * -2 + 1;
                      psVar186 = (secp256k1_ge *)((long)psVar186 + (ulong)bVar229 * -0x10 + 8);
                    }
                    secp256k1_ge_to_storage
                              ((secp256k1_ge_storage *)auStack_1690,(secp256k1_ge *)auStack_1390);
                    auStack_1b00._8_8_ = auStack_1660._8_8_;
                    auStack_1b00._0_8_ = auStack_1660._0_8_;
                    auStack_1b10._8_4_ = (int)uStack_1668;
                    auStack_1b10._0_8_ = uStack_1670;
                    auStack_1b10._12_4_ = uStack_1668._4_4_;
                    auStack_1b20 = auStack_1680;
                    auStack_1b30 = auStack_1690;
                    auStack_1690 = (undefined1  [16])0x0;
                    auStack_1680._0_15_ = SUB1615((undefined1  [16])0x0,0);
                    auStack_1680[0xf] = (char)psStack_1c98;
                    a = ctx;
                    uVar192 = secp256k1_ecdsa_verify
                                        (ctx,(secp256k1_ecdsa_signature *)auStack_1990,
                                         (uchar *)auStack_1690,(secp256k1_pubkey *)auStack_1b30);
                    uVar182 = num_cores;
                    if ((uVar180 < 7 & uVar191) != uVar192) goto LAB_00117a74;
                  }
                  lVar201 = lVar201 + 1;
                  iVar179 = iVar179 + (int)uVar200;
                  uVar215 = (ulong)(uint)((int)uVar215 + (int)uVar200);
                } while (lVar201 != 0xd);
                iVar205 = (int)psStack_1c98 + 1;
                iVar179 = (int)psStack_1c90 + 1;
                psStack_1c98 = (secp256k1_gej *)CONCAT44(psStack_1c98._4_4_,iVar205);
              } while (iVar205 != 0xd);
              uVar200 = uVar200 + 1;
              iVar179 = (int)uStack_1c30 + 1;
            } while (uVar200 != 0xd);
            uVar180 = uVar180 + 1;
            uStack_1cd0._0_4_ = (uint)uStack_1cd0 + -1;
          } while (uVar180 != 0xd);
          uVar200 = 1;
          puVar226 = auStack_19d0;
          puVar206 = auStack_1b30;
          do {
            auStack_1c20 = (undefined1  [16])0x0;
            auStack_1c10._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1c10[0xf] = (char)uVar200;
            lVar201 = uVar200 - 1;
            a = ctx;
            iVar179 = secp256k1_keypair_create
                                (ctx,(secp256k1_keypair *)
                                     (auStack_1390 + (lVar201 * 0xc + -1) * 8 + 8),auStack_1c20);
            if (iVar179 == 0) goto LAB_00117aba;
            a = ctx;
            iVar179 = secp256k1_ec_pubkey_create
                                (ctx,(secp256k1_pubkey *)(auStack_1690 + lVar201 * 0x40),
                                 auStack_1c20);
            if (iVar179 == 0) goto LAB_00117abf;
            psVar223 = (secp256k1_xonly_pubkey *)(auStack_1990 + lVar201 * 0x40);
            pk_parity = (uint *)(auStack_1c70 + lVar201 * 4);
            a = ctx;
            iVar179 = secp256k1_keypair_xonly_pub
                                (ctx,psVar223,(int *)pk_parity,
                                 (secp256k1_keypair *)(auStack_1390 + (lVar201 * 0xc + -1) * 8 + 8))
            ;
            if (iVar179 == 0) goto LAB_00117ac4;
            puVar222 = auStack_1b30 + lVar201 * 0x20;
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_serialize(ctx,puVar222,psVar223);
            if (iVar179 == 0) goto LAB_00117ac9;
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_parse(ctx,psVar223,puVar222);
            if (iVar179 == 0) goto LAB_00117ace;
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_serialize(ctx,auStack_1c20,psVar223);
            if (iVar179 == 0) goto LAB_00117ad3;
            lVar193 = 0;
            do {
              if (puVar206[lVar193] != auStack_1c20[lVar193]) goto LAB_00117b14;
              lVar193 = lVar193 + 1;
            } while (lVar193 != 0x20);
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_from_pubkey
                                (ctx,psVar223,(int *)(auStack_1bf0 + 0x50),
                                 (secp256k1_pubkey *)(auStack_1690 + lVar201 * 0x40));
            if (iVar179 == 0) goto LAB_00117ad8;
            if (auStack_1ba0._0_4_ != *pk_parity) goto LAB_00117add;
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_serialize(ctx,auStack_1c20,psVar223);
            if (iVar179 == 0) goto LAB_00117ae2;
            lVar201 = 0;
            do {
              if (puVar206[lVar201] != auStack_1c20[lVar201]) goto LAB_00117b19;
              lVar201 = lVar201 + 1;
            } while (lVar201 != 0x20);
            a = (secp256k1_context *)auStack_1bf0;
            secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)a,puVar222);
            auStack_1bf0._40_8_ = (void *)0x1;
            secp256k1_fe_verify((secp256k1_fe *)a);
            lVar201 = uVar200 * 0x68;
            psVar202 = a;
            iVar179 = secp256k1_fe_equal_var
                                ((secp256k1_fe *)a,(secp256k1_fe *)(auStack_f10 + lVar201));
            if (iVar179 == 0) goto LAB_00117ae7;
            auStack_1bf0._0_8_ = *(undefined8 *)(auStack_f10 + lVar201 + 0x30);
            auStack_1bf0._8_8_ = *(undefined8 *)(auStack_f10 + lVar201 + 0x38);
            auStack_1bf0._16_8_ = *(undefined8 *)(auStack_f10 + lVar201 + 0x40);
            auStack_1bf0._24_8_ = *(undefined8 *)(auStack_f10 + lVar201 + 0x48);
            auStack_1bf0._32_4_ = *(undefined4 *)(auStack_f10 + lVar201 + 0x50);
            auStack_1bf0._36_4_ = *(undefined4 *)(auStack_f10 + lVar201 + 0x54);
            auStack_1bf0._44_4_ = *(undefined4 *)(auStack_f10 + lVar201 + 0x5c);
            auStack_1bf0._40_4_ = *(undefined4 *)(auStack_f10 + lVar201 + 0x58);
            secp256k1_fe_normalize_var((secp256k1_fe *)a);
            secp256k1_fe_verify((secp256k1_fe *)a);
            if (auStack_1bf0._44_4_ == 0) goto LAB_00117aec;
            if ((auStack_1bf0._0_4_ & 1) != *pk_parity) goto LAB_00117af1;
            if (6 < uVar200) {
              lVar201 = 0;
              do {
                if (puVar206[lVar201] != puVar226[lVar201]) goto LAB_00117b1e;
                lVar201 = lVar201 + 1;
              } while (lVar201 != 0x20);
              if ((auStack_1bf0._0_4_ & 1) != 1U - *(int *)(auStack_1c70 + (0xc - uVar200) * 4))
              goto LAB_00117b0a;
            }
            uVar200 = uVar200 + 1;
            puVar206 = puVar206 + 0x20;
            puVar226 = puVar226 + -0x20;
          } while (uVar200 != 0xd);
          lVar201 = 0;
          do {
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_parse
                                (ctx,(secp256k1_xonly_pubkey *)auStack_1390,
                                 invalid_pubkey_bytes[0] + lVar201);
            if (iVar179 != 0) goto LAB_00117af6;
            lVar201 = lVar201 + 0x20;
            keypair = (secp256k1_keypair *)auStack_1390;
          } while (lVar201 != 0xe0);
          lVar201 = -0xc;
          psVar223 = (secp256k1_xonly_pubkey *)auStack_1690;
          piVar197 = (int *)auStack_1bf0;
          puVar222 = auStack_1990;
          do {
            auStack_1b30 = (undefined1  [16])0x0;
            auStack_1b20._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b20[0xf] = (char)lVar201 + '\r';
            a = ctx;
            iVar179 = secp256k1_keypair_create(ctx,keypair,auStack_1b30);
            if (iVar179 == 0) goto LAB_00117afb;
            a = ctx;
            iVar179 = secp256k1_keypair_xonly_pub(ctx,psVar223,piVar197,keypair);
            if (iVar179 == 0) goto LAB_00117b00;
            a = ctx;
            iVar179 = secp256k1_xonly_pubkey_serialize(ctx,puVar222,psVar223);
            if (iVar179 == 0) goto LAB_00117b05;
            puVar222 = puVar222 + 0x20;
            piVar197 = piVar197 + 1;
            psVar223 = psVar223 + 1;
            keypair = keypair + 1;
            lVar201 = lVar201 + 1;
          } while (lVar201 != 0);
          sStack_1b48._0_8_ = (void *)0x8cb36fda;
          psStack_1cc8 = (secp256k1_scalar *)0x1;
          uStack_1cd0 = 0;
          do {
            iVar179 = 0xd - (int)psStack_1cc8;
            if ((&iStack_1bf4)[(long)psStack_1cc8] == 0) {
              iVar179 = (int)psStack_1cc8;
            }
            iStack_1c9c = 1;
            do {
              auStack_1c50 = (undefined1  [16])0x0;
              auStack_1c60 = (undefined1  [16])0x0;
              auStack_1c70 = (undefined1  [16])0x0;
              iStack_1c40 = 0;
              if (((ulong)num_cores == 1) ||
                 (uStack_1cd0 = uStack_1cd0 + 0xe7037ed1a0b428db,
                 (uint32_t)
                 ((uStack_1cd0 >> 0x20 ^ uStack_1cd0 & 0xffffffff) * (ulong)num_cores >> 0x20) ==
                 this_core)) {
                sStack_1b48.noncefp = secp256k1_hardened_nonce_function_smallint;
                sStack_1b48.ndata = &iStack_1c9c;
                iVar205 = 0xd - iStack_1c9c;
                if ((&iStack_1bf4)[iStack_1c9c] == 0) {
                  iVar205 = iStack_1c9c;
                }
                iVar224 = 0;
                do {
                  secp256k1_testrand256(auStack_1c20);
                  secp256k1_schnorrsig_challenge
                            (&uStack_1c24,auStack_19b0 + (long)iStack_1c9c * 0x20,auStack_1c20,0x20,
                             auStack_1990 + ((long)psStack_1cc8 + -1) * 0x20);
                  uVar200 = (ulong)uStack_1c24;
                  if (*(int *)(auStack_1c70 + uVar200 * 4) == 0) {
                    uVar180 = uStack_1c24 * iVar179 + iVar205;
                    auStack_1ba0 = (undefined1  [16])0x0;
                    auStack_1b90._0_15_ = SUB1615((undefined1  [16])0x0,0);
                    auStack_1b90[0xf] =
                         (char)uVar180 - ((char)(uVar180 / 0xd) + (char)(uVar180 / 0xd) * '\f');
                    a = ctx;
                    iVar181 = secp256k1_schnorrsig_sign_custom
                                        (ctx,auStack_1b30,auStack_1c20,0x20,
                                         (secp256k1_keypair *)
                                         (auStack_1390 +
                                         (((long)psStack_1cc8 + -1) * 0xc + -1) * 8 + 8),
                                         &sStack_1b48);
                    if (iVar181 == 0) goto LAB_00117a97;
                    lVar201 = 0;
                    do {
                      if (auStack_1b30[lVar201] != auStack_19b0[lVar201 + (long)iStack_1c9c * 0x20])
                      goto LAB_00117ab0;
                      lVar201 = lVar201 + 1;
                    } while (lVar201 != 0x20);
                    lVar201 = 0;
                    do {
                      if (auStack_1b10[lVar201] != auStack_1bf0[lVar201 + 0x50]) goto LAB_00117ab5;
                      lVar201 = lVar201 + 1;
                    } while (lVar201 != 0x20);
                    *(undefined4 *)(auStack_1c70 + uVar200 * 4) = 1;
                    iVar224 = iVar224 + 1;
                  }
                } while (iVar224 < 0xd);
              }
              iVar205 = iStack_1c9c + 1;
              bVar228 = iStack_1c9c < 0xc;
              iStack_1c9c = iVar205;
            } while (bVar228);
            psStack_1cc8 = (secp256k1_scalar *)((long)psStack_1cc8 + 1);
          } while (psStack_1cc8 != (secp256k1_scalar *)0xd);
          psStack_1c90 = (secp256k1_gej *)0x1;
          psStack_1c98 = (secp256k1_gej *)0x0;
          do {
            puVar226 = &psStack_1c90[-1].field_0x97;
            auStack_1c10 = *(undefined1 (*) [16])(auStack_1990 + (long)puVar226 * 0x20 + 0x10);
            iVar179 = 0xd - (int)psStack_1c90;
            if ((&iStack_1bf4)[(long)psStack_1c90] == 0) {
              iVar179 = (int)psStack_1c90;
            }
            auStack_1c20._8_8_ = *(undefined8 *)(auStack_1990 + (long)puVar226 * 0x20 + 8);
            auStack_1c20._0_8_ = *(undefined8 *)(auStack_1990 + (long)puVar226 * 0x20);
            uStack_1cc0 = 1;
            do {
              auStack_1c50 = (undefined1  [16])0x0;
              auStack_1c60 = (undefined1  [16])0x0;
              auStack_1c70 = (undefined1  [16])0x0;
              iStack_1c40 = 0;
              if (((ulong)num_cores == 1) ||
                 (psStack_1c98 = (secp256k1_gej *)((long)psStack_1c98[-0x2a150f76858d35].y.n + 0x23)
                 , (uint32_t)
                   (((ulong)psStack_1c98 >> 0x20 ^ (ulong)psStack_1c98 & 0xffffffff) *
                    (ulong)num_cores >> 0x20) == this_core)) {
                if (uStack_1cc0 < 7) {
                  lVar201 = uStack_1cc0 - 1;
                  auStack_1b20 = *(undefined1 (*) [16])(auStack_1990 + lVar201 * 0x20 + 0x10);
                  auStack_1b30._8_8_ = *(undefined8 *)(auStack_1990 + lVar201 * 0x20 + 8);
                  auStack_1b30._0_8_ = *(undefined8 *)(auStack_1990 + lVar201 * 0x20);
                  iVar205 = 0xd - (int)uStack_1cc0;
                  if ((&iStack_1bf4)[uStack_1cc0] == 0) {
                    iVar205 = (int)uStack_1cc0;
                  }
                }
                else {
                  auStack_1b30 = *(undefined1 (*) [16])(secp256k1_ellswift_c3.n + uStack_1cc0 * 4);
                  auStack_1b20 = *(undefined1 (*) [16])
                                  (secp256k1_ellswift_c3.n + uStack_1cc0 * 4 + 2);
                  iVar205 = -1;
                }
                iVar224 = 0;
                do {
                  secp256k1_testrand256(auStack_1bf0 + 0x50);
                  secp256k1_schnorrsig_challenge
                            ((secp256k1_scalar *)&sStack_1b48,auStack_1b30,auStack_1bf0 + 0x50,0x20,
                             auStack_1c20);
                  uVar200 = sStack_1b48._0_8_ & 0xffffffff;
                  if (*(int *)(auStack_1c70 + uVar200 * 4) == 0) {
                    uVar180 = (int)sStack_1b48.magic * iVar179 + iVar205;
                    iVar181 = 0;
                    uVar191 = 0;
                    do {
                      if (iVar181 == 0xe) {
                        secp256k1_testrand256(auStack_1b10);
                        uVar192 = 0;
                      }
                      else {
                        auStack_1b10 = (undefined1  [16])0x0;
                        auStack_1b00._0_15_ = SUB1615((undefined1  [16])0x0,0);
                        auStack_1b00[0xf] = (char)iVar181;
                        uVar192 = 0;
                        if (iVar181 != 0xd && iVar205 != -1) {
                          uVar192 = (uint)(uVar180 - (uVar180 / 0xd + (uVar180 / 0xd) * 0xc) ==
                                          iVar181);
                        }
                      }
                      a = ctx;
                      uVar183 = secp256k1_schnorrsig_verify
                                          (ctx,auStack_1b30,auStack_1bf0 + 0x50,0x20,
                                           (secp256k1_xonly_pubkey *)
                                           (auStack_1690 + (long)puVar226 * 0x40));
                      if (uVar183 != uVar192) goto LAB_00117a9c;
                      uVar191 = uVar191 + uVar192;
                      iVar181 = iVar181 + 1;
                    } while (iVar181 != 0xf);
                    if (uVar191 != (iVar205 != -1)) goto LAB_00117b0f;
                    *(undefined4 *)(auStack_1c70 + uVar200 * 4) = 1;
                    iVar224 = iVar224 + 1;
                  }
                } while (iVar224 < 0xd);
              }
              uStack_1cc0 = uStack_1cc0 + 1;
            } while (uStack_1cc0 != 0xe);
            psStack_1c90 = (secp256k1_gej *)((long)(psStack_1c90->x).n + 1);
          } while (psStack_1c90 != (secp256k1_gej *)0x7);
          lVar201 = -0xc;
          psVar186 = (secp256k1_ge *)(auStack_f10 + 0x68);
          do {
            auStack_1b30 = (undefined1  [16])0x0;
            auStack_1b20._0_15_ = SUB1615((undefined1  [16])0x0,0);
            auStack_1b20[0xf] = (char)lVar201 + '\r';
            a = ctx;
            iVar179 = secp256k1_ellswift_create(ctx,auStack_1690,auStack_1b30,(uchar *)0x0);
            if (iVar179 == 0) goto LAB_00117b23;
            secp256k1_ellswift_decode(ctx,(secp256k1_pubkey *)auStack_1990,auStack_1690);
            secp256k1_pubkey_load(ctx,(secp256k1_ge *)auStack_1390,(secp256k1_pubkey *)auStack_1990)
            ;
            ge_equals_ge((secp256k1_ge *)auStack_1390,psVar186);
            psVar186 = (secp256k1_ge *)((long)(&psVar186->x + 2) + 8);
            lVar201 = lVar201 + 1;
          } while (lVar201 != 0);
          secp256k1_context_destroy(ctx);
          iVar179 = count;
        }
        goto LAB_00117a88;
      }
      goto LAB_00117aab;
    }
    goto LAB_00117a7e;
  }
LAB_00117aa1:
  main_cold_52();
LAB_00117aa6:
  main_cold_51();
LAB_00117aab:
  main_cold_49();
LAB_00117ab0:
  main_cold_19();
LAB_00117ab5:
  main_cold_20();
LAB_00117aba:
  main_cold_37();
LAB_00117abf:
  main_cold_36();
LAB_00117ac4:
  main_cold_35();
LAB_00117ac9:
  main_cold_34();
LAB_00117ace:
  main_cold_33();
LAB_00117ad3:
  main_cold_32();
LAB_00117ad8:
  main_cold_31();
LAB_00117add:
  main_cold_13();
LAB_00117ae2:
  main_cold_30();
  psVar202 = a;
LAB_00117ae7:
  a = psVar202;
  main_cold_29();
LAB_00117aec:
  main_cold_28();
LAB_00117af1:
  main_cold_15();
LAB_00117af6:
  main_cold_18();
LAB_00117afb:
  main_cold_27();
LAB_00117b00:
  main_cold_26();
LAB_00117b05:
  main_cold_25();
LAB_00117b0a:
  main_cold_17();
LAB_00117b0f:
  main_cold_22();
LAB_00117b14:
  main_cold_12();
LAB_00117b19:
  main_cold_14();
LAB_00117b1e:
  main_cold_16();
LAB_00117b23:
  main_cold_23();
  lVar201 = 0;
  do {
    uVar216 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
              secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
    uVar199 = secp256k1_test_state[1] << 0x11;
    uVar215 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
    uVar200 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
    secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar215;
    secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar200;
    secp256k1_test_state[3] = uVar200 << 0x2d | uVar200 >> 0x13;
    secp256k1_test_state[2] = uVar215 ^ uVar199;
    (a->ecmult_gen_ctx).initial.x.n[lVar201 + -1] = uVar216;
    lVar201 = lVar201 + 1;
  } while ((int)lVar201 != 4);
  return (int)secp256k1_test_state[0];
LAB_00117a3d:
  main_cold_43();
LAB_00117a42:
  main_cold_42();
LAB_00117a47:
  main_cold_39();
LAB_00117a4c:
  main_cold_38();
LAB_00117a51:
  main_cold_10();
LAB_00117a56:
  main_cold_4();
  a = psVar202;
LAB_00117a5b:
  main_cold_5();
LAB_00117a60:
  main_cold_47();
LAB_00117a65:
  main_cold_46();
LAB_00117a6a:
  main_cold_6();
LAB_00117a6f:
  main_cold_7();
LAB_00117a74:
  main_cold_11();
LAB_00117a79:
  main_cold_41();
LAB_00117a7e:
  main_cold_50();
LAB_00117a83:
  main_cold_3();
LAB_00117a88:
  main_cold_48();
LAB_00117a8d:
  main_cold_45();
LAB_00117a92:
  main_cold_44();
LAB_00117a97:
  main_cold_24();
LAB_00117a9c:
  main_cold_21();
  goto LAB_00117aa1;
}

Assistant:

static int secp256k1_ecmult_const_xonly(secp256k1_fe* r, const secp256k1_fe *n, const secp256k1_fe *d, const secp256k1_scalar *q, int known_on_curve) {

    /* This algorithm is a generalization of Peter Dettman's technique for
     * avoiding the square root in a random-basepoint x-only multiplication
     * on a Weierstrass curve:
     * https://mailarchive.ietf.org/arch/msg/cfrg/7DyYY6gg32wDgHAhgSb6XxMDlJA/
     *
     *
     * === Background: the effective affine technique ===
     *
     * Let phi_u be the isomorphism that maps (x, y) on secp256k1 curve y^2 = x^3 + 7 to
     * x' = u^2*x, y' = u^3*y on curve y'^2 = x'^3 + u^6*7. This new curve has the same order as
     * the original (it is isomorphic), but moreover, has the same addition/doubling formulas, as
     * the curve b=7 coefficient does not appear in those formulas (or at least does not appear in
     * the formulas implemented in this codebase, both affine and Jacobian). See also Example 9.5.2
     * in https://www.math.auckland.ac.nz/~sgal018/crypto-book/ch9.pdf.
     *
     * This means any linear combination of secp256k1 points can be computed by applying phi_u
     * (with non-zero u) on all input points (including the generator, if used), computing the
     * linear combination on the isomorphic curve (using the same group laws), and then applying
     * phi_u^{-1} to get back to secp256k1.
     *
     * Switching to Jacobian coordinates, note that phi_u applied to (X, Y, Z) is simply
     * (X, Y, Z/u). Thus, if we want to compute (X1, Y1, Z) + (X2, Y2, Z), with identical Z
     * coordinates, we can use phi_Z to transform it to (X1, Y1, 1) + (X2, Y2, 1) on an isomorphic
     * curve where the affine addition formula can be used instead.
     * If (X3, Y3, Z3) = (X1, Y1) + (X2, Y2) on that curve, then our answer on secp256k1 is
     * (X3, Y3, Z3*Z).
     *
     * This is the effective affine technique: if we have a linear combination of group elements
     * to compute, and all those group elements have the same Z coordinate, we can simply pretend
     * that all those Z coordinates are 1, perform the computation that way, and then multiply the
     * original Z coordinate back in.
     *
     * The technique works on any a=0 short Weierstrass curve. It is possible to generalize it to
     * other curves too, but there the isomorphic curves will have different 'a' coefficients,
     * which typically does affect the group laws.
     *
     *
     * === Avoiding the square root for x-only point multiplication ===
     *
     * In this function, we want to compute the X coordinate of q*(n/d, y), for
     * y = sqrt((n/d)^3 + 7). Its negation would also be a valid Y coordinate, but by convention
     * we pick whatever sqrt returns (which we assume to be a deterministic function).
     *
     * Let g = y^2*d^3 = n^3 + 7*d^3. This also means y = sqrt(g/d^3).
     * Further let v = sqrt(d*g), which must exist as d*g = y^2*d^4 = (y*d^2)^2.
     *
     * The input point (n/d, y) also has Jacobian coordinates:
     *
     *     (n/d, y, 1)
     *   = (n/d * v^2, y * v^3, v)
     *   = (n/d * d*g, y * sqrt(d^3*g^3), v)
     *   = (n/d * d*g, sqrt(y^2 * d^3*g^3), v)
     *   = (n*g, sqrt(g/d^3 * d^3*g^3), v)
     *   = (n*g, sqrt(g^4), v)
     *   = (n*g, g^2, v)
     *
     * It is easy to verify that both (n*g, g^2, v) and its negation (n*g, -g^2, v) have affine X
     * coordinate n/d, and this holds even when the square root function doesn't have a
     * deterministic sign. We choose the (n*g, g^2, v) version.
     *
     * Now switch to the effective affine curve using phi_v, where the input point has coordinates
     * (n*g, g^2). Compute (X, Y, Z) = q * (n*g, g^2) there.
     *
     * Back on secp256k1, that means q * (n*g, g^2, v) = (X, Y, v*Z). This last point has affine X
     * coordinate X / (v^2*Z^2) = X / (d*g*Z^2). Determining the affine Y coordinate would involve
     * a square root, but as long as we only care about the resulting X coordinate, no square root
     * is needed anywhere in this computation.
     */

    secp256k1_fe g, i;
    secp256k1_ge p;
    secp256k1_gej rj;

    /* Compute g = (n^3 + B*d^3). */
    secp256k1_fe_sqr(&g, n);
    secp256k1_fe_mul(&g, &g, n);
    if (d) {
        secp256k1_fe b;
#ifdef VERIFY
        VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero(d));
#endif
        secp256k1_fe_sqr(&b, d);
        VERIFY_CHECK(SECP256K1_B <= 8); /* magnitude of b will be <= 8 after the next call */
        secp256k1_fe_mul_int(&b, SECP256K1_B);
        secp256k1_fe_mul(&b, &b, d);
        secp256k1_fe_add(&g, &b);
        if (!known_on_curve) {
            /* We need to determine whether (n/d)^3 + 7 is square.
             *
             *     is_square((n/d)^3 + 7)
             * <=> is_square(((n/d)^3 + 7) * d^4)
             * <=> is_square((n^3 + 7*d^3) * d)
             * <=> is_square(g * d)
             */
            secp256k1_fe c;
            secp256k1_fe_mul(&c, &g, d);
            if (!secp256k1_fe_is_square_var(&c)) return 0;
        }
    } else {
        secp256k1_fe_add_int(&g, SECP256K1_B);
        if (!known_on_curve) {
            /* g at this point equals x^3 + 7. Test if it is square. */
            if (!secp256k1_fe_is_square_var(&g)) return 0;
        }
    }

    /* Compute base point P = (n*g, g^2), the effective affine version of (n*g, g^2, v), which has
     * corresponding affine X coordinate n/d. */
    secp256k1_fe_mul(&p.x, &g, n);
    secp256k1_fe_sqr(&p.y, &g);
    p.infinity = 0;

    /* Perform x-only EC multiplication of P with q. */
#ifdef VERIFY
    VERIFY_CHECK(!secp256k1_scalar_is_zero(q));
#endif
    secp256k1_ecmult_const(&rj, &p, q);
#ifdef VERIFY
    VERIFY_CHECK(!secp256k1_gej_is_infinity(&rj));
#endif

    /* The resulting (X, Y, Z) point on the effective-affine isomorphic curve corresponds to
     * (X, Y, Z*v) on the secp256k1 curve. The affine version of that has X coordinate
     * (X / (Z^2*d*g)). */
    secp256k1_fe_sqr(&i, &rj.z);
    secp256k1_fe_mul(&i, &i, &g);
    if (d) secp256k1_fe_mul(&i, &i, d);
    secp256k1_fe_inv(&i, &i);
    secp256k1_fe_mul(r, &rj.x, &i);

    return 1;
}